

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O1

Result __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::duplicateCols(SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *lp,bool *again)

{
  int *piVar1;
  pointer pDVar2;
  undefined8 *puVar3;
  uint *puVar4;
  Real *pRVar5;
  bool bVar6;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar7;
  undefined8 uVar8;
  Tolerances *pTVar9;
  Item *pIVar10;
  DataKey *pDVar11;
  int *piVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  undefined1 auVar16 [16];
  undefined8 uVar17;
  undefined1 uVar18;
  Result RVar19;
  int iVar20;
  int iVar21;
  double *pdVar22;
  DuplicateColsPS *pDVar23;
  FixBoundsPS *pFVar24;
  cpp_dec_float<50U,_int,_void> *pcVar25;
  SPxOut *pSVar26;
  long lVar27;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar28;
  pointer pDVar29;
  bool bVar30;
  int iVar31;
  long lVar32;
  uint uVar33;
  long lVar34;
  bool bVar35;
  int iVar36;
  cpp_dec_float<50U,_int,_void> *pcVar37;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var38;
  ulong uVar39;
  ulong uVar40;
  pointer pnVar41;
  long lVar42;
  double dVar43;
  ulong uVar44;
  Real RVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  fpclass_type local_938;
  DataArray<int> da_perm;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  factor;
  int *perm;
  uint auStack_890 [2];
  uint local_888 [2];
  uint auStack_880 [2];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_878;
  int local_870;
  bool local_86c;
  long local_868;
  Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
  *local_858;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_850;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_848;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_840;
  double local_838;
  undefined8 uStack_830;
  double local_828;
  undefined8 uStack_820;
  long local_810;
  int *idxMem;
  Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  scale;
  DataArray<int> pClass;
  DataArray<bool> remCol;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_3;
  cpp_dec_float<50U,_int,_void> local_758;
  long local_718;
  undefined8 uStack_710;
  ulong local_700;
  DataArray<int> classSize;
  DataArray<bool> fixAndRemCol;
  long local_6c8;
  shared_ptr<soplex::Tolerances> local_6b8;
  shared_ptr<soplex::Tolerances> local_6a8;
  shared_ptr<soplex::Tolerances> local_698;
  shared_ptr<soplex::Tolerances> local_688;
  shared_ptr<soplex::Tolerances> local_678;
  shared_ptr<soplex::Tolerances> local_668;
  shared_ptr<soplex::Tolerances> local_658;
  DataArray<int> m_perm_empty;
  DataArray<int> local_628;
  DataArray<int> local_610;
  int *local_5f8;
  uint auStack_5f0 [4];
  undefined5 uStack_5e0;
  undefined3 uStack_5db;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_5d8;
  int local_5d0;
  undefined1 local_5cc;
  long local_5c8;
  DataArray<int> local_5c0;
  int *local_5a8;
  uint auStack_5a0 [4];
  undefined5 uStack_590;
  undefined3 uStack_58b;
  undefined5 local_588;
  undefined3 uStack_583;
  int local_580;
  undefined1 local_57c;
  long local_578;
  int *local_568;
  uint auStack_560 [4];
  undefined5 uStack_550;
  undefined3 uStack_54b;
  undefined5 local_548;
  undefined3 uStack_543;
  int local_540;
  undefined1 local_53c;
  long local_538;
  int *local_528;
  uint auStack_520 [4];
  undefined5 uStack_510;
  undefined3 uStack_50b;
  undefined5 local_508;
  undefined3 uStack_503;
  int local_500;
  undefined1 local_4fc;
  long local_4f8;
  int *local_4e8;
  uint auStack_4e0 [4];
  undefined5 uStack_4d0;
  undefined3 uStack_4cb;
  undefined5 local_4c8;
  undefined3 uStack_4c3;
  int local_4c0;
  undefined1 local_4bc;
  long local_4b8;
  cpp_dec_float<50u,int,void> local_4a8 [8];
  uint auStack_4a0 [2];
  uint local_498 [2];
  undefined5 uStack_490;
  undefined3 uStack_48b;
  uint local_488 [3];
  undefined1 local_47c;
  undefined8 local_478;
  int *local_468;
  uint auStack_460 [2];
  uint local_458 [2];
  uint auStack_450 [2];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_448;
  DataArray<int> local_438;
  undefined8 uStack_420;
  undefined8 local_418;
  DataArray<int> local_408;
  undefined8 uStack_3f0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3e8;
  DataArray<int> local_3d8;
  undefined8 uStack_3c0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3b8;
  DataArray<int> local_3a8;
  undefined8 uStack_390;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_388;
  DataArray<int> local_378;
  undefined8 uStack_360;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_358;
  uint local_348 [2];
  uint auStack_340 [2];
  uint local_338 [2];
  uint auStack_330 [2];
  uint local_328 [4];
  uint local_318 [2];
  uint auStack_310 [2];
  uint local_308 [2];
  uint auStack_300 [2];
  uint local_2f8 [4];
  int *local_2e8;
  uint auStack_2e0 [2];
  uint local_2d8 [2];
  uint auStack_2d0 [2];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2c8;
  DataArray<int> local_2b8;
  Real RStack_2a0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_298;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_288;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_248;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_208;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1c8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_188;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined5 uStack_130;
  undefined3 uStack_12b;
  undefined5 uStack_128;
  undefined8 uStack_123;
  undefined8 local_118;
  cpp_dec_float<50U,_int,_void> local_110;
  cpp_dec_float<50U,_int,_void> local_d8;
  cpp_dec_float<50U,_int,_void> local_a0;
  undefined1 local_68 [29];
  undefined3 uStack_4b;
  undefined1 auStack_48 [13];
  undefined8 local_38;
  
  RVar19 = removeEmpty(this,lp);
  if (RVar19 == OKAY) {
    pClass.thesize =
         (lp->
         super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).
         super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         .set.thenum;
    RVar19 = OKAY;
    if (1 < pClass.thesize) {
      pClass.data = (int *)0x0;
      pClass.memFactor = 1.2;
      pClass.themax = pClass.thesize;
      spx_alloc<int*>(&pClass.data,pClass.thesize);
      iVar31 = (lp->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum;
      classSize.data = (int *)0x0;
      classSize.memFactor = 1.2;
      classSize.thesize = 0;
      if (0 < iVar31) {
        classSize.thesize = iVar31;
      }
      classSize.themax = 1;
      if (0 < iVar31) {
        classSize.themax = classSize.thesize;
      }
      spx_alloc<int*>(&classSize.data,classSize.themax);
      Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::Array(&scale,(lp->
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .set.thenum);
      idxMem = (int *)0x0;
      spx_alloc<int*>(&idxMem,(lp->
                              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).
                              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .set.thenum);
      piVar12 = idxMem;
      *pClass.data = 0;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)
                 scale.data.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,0.0);
      *classSize.data =
           (lp->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).
           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .set.thenum;
      iVar31 = 0;
      if (1 < (lp->
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.thenum) {
        lVar34 = 1;
        iVar31 = 0;
        lVar42 = 0x38;
        do {
          pClass.data[lVar34] = 0;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)
                     ((long)((scale.data.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                     lVar42),0.0);
          classSize.data[lVar34] = 0;
          piVar12[lVar34 + -1] = (int)lVar34;
          lVar34 = lVar34 + 1;
          iVar31 = iVar31 + 1;
          lVar42 = lVar42 + 0x38;
        } while (lVar34 < (lp->
                          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .set.thenum);
      }
      local_5c8 = 0xa00000000;
      local_5f8 = (int *)0x0;
      auStack_5f0[0] = 0;
      auStack_5f0[1] = 0;
      auStack_5f0[2] = 0;
      auStack_5f0[3] = 0;
      uStack_5e0 = 0;
      uStack_5db = 0;
      local_5d8 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)0x0;
      local_5d0 = 0;
      local_5cc = 0;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_5f8,0.0);
      if (0 < (lp->
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.thenum) {
        dVar43 = 0.0;
        do {
          pIVar10 = (lp->
                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .set.theitem +
                    (lp->
                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .set.thekey[(long)dVar43].idx;
          local_838 = dVar43;
          if (0 < (pIVar10->data).
                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .memused) {
            lVar42 = 0;
            lVar34 = 0;
            do {
              pnVar41 = scale.data.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pNVar7 = (pIVar10->data).
                       super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .m_elem;
              uVar8 = *(undefined8 *)((long)(pNVar7->val).m_backend.data._M_elems + lVar42 + 0x20);
              result_2.m_backend.data._M_elems._32_5_ = SUB85(uVar8,0);
              result_2.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar8 >> 0x28);
              result_2.m_backend.data._M_elems._0_16_ =
                   *(undefined1 (*) [16])((long)(pNVar7->val).m_backend.data._M_elems + lVar42);
              puVar4 = (uint *)((long)(pNVar7->val).m_backend.data._M_elems + lVar42 + 0x10);
              result_2.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar4;
              uVar8 = *(undefined8 *)(puVar4 + 2);
              result_2.m_backend.data._M_elems._24_5_ = SUB85(uVar8,0);
              result_2.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar8 >> 0x28);
              result_2.m_backend.exp = *(int *)((long)(&(pNVar7->val).m_backend.data + 1) + lVar42);
              result_2.m_backend.neg =
                   *(bool *)((long)(&(pNVar7->val).m_backend.data + 1) + lVar42 + 4);
              result_2.m_backend._48_8_ =
                   *(undefined8 *)((long)(&(pNVar7->val).m_backend.data + 1) + lVar42 + 8);
              iVar36 = *(int *)((long)(&((pIVar10->data).
                                         super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        .m_elem)->val + 1) + lVar42);
              if (scale.data.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar36].m_backend.fpclass !=
                  cpp_dec_float_NaN) {
                result.m_backend.fpclass = cpp_dec_float_finite;
                result.m_backend.prec_elem = 10;
                result.m_backend.data._M_elems[0] = 0;
                result.m_backend.data._M_elems[1] = 0;
                result.m_backend.data._M_elems[2] = 0;
                result.m_backend.data._M_elems[3] = 0;
                result.m_backend.data._M_elems[4] = 0;
                result.m_backend.data._M_elems[5] = 0;
                result.m_backend.data._M_elems._24_5_ = 0;
                result.m_backend.data._M_elems[7]._1_3_ = 0;
                result.m_backend.data._M_elems._32_5_ = 0;
                result.m_backend.data._M_elems[9]._1_3_ = 0;
                result.m_backend.exp = 0;
                result.m_backend.neg = false;
                boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                          ((cpp_dec_float<50u,int,void> *)&result,0.0);
                iVar20 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (&pnVar41[iVar36].m_backend,&result.m_backend);
                if (iVar20 == 0) {
                  *(ulong *)(scale.data.
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[iVar36].m_backend.data.
                             _M_elems + 8) =
                       CONCAT35(result_2.m_backend.data._M_elems[9]._1_3_,
                                result_2.m_backend.data._M_elems._32_5_);
                  puVar4 = scale.data.
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[iVar36].m_backend.data._M_elems
                           + 4;
                  *(undefined8 *)puVar4 = result_2.m_backend.data._M_elems._16_8_;
                  *(ulong *)(puVar4 + 2) =
                       CONCAT35(result_2.m_backend.data._M_elems[7]._1_3_,
                                result_2.m_backend.data._M_elems._24_5_);
                  *(undefined8 *)
                   scale.data.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar36].m_backend.data._M_elems =
                       result_2.m_backend.data._M_elems._0_8_;
                  *(undefined8 *)
                   (scale.data.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[iVar36].m_backend.data._M_elems + 2) =
                       result_2.m_backend.data._M_elems._8_8_;
                  scale.data.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar36].m_backend.exp =
                       result_2.m_backend.exp;
                  scale.data.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar36].m_backend.neg =
                       result_2.m_backend.neg;
                  scale.data.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar36].m_backend.fpclass =
                       result_2.m_backend.fpclass;
                  scale.data.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar36].m_backend.prec_elem =
                       result_2.m_backend.prec_elem;
                }
              }
              iVar20 = pClass.data[iVar36];
              pDVar29 = (this->m_classSetCols).data.
                        super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              result.m_backend.fpclass = cpp_dec_float_finite;
              result.m_backend.prec_elem = 10;
              result.m_backend.data._M_elems[0] = 0;
              result.m_backend.data._M_elems[1] = 0;
              result.m_backend.data._M_elems[2] = 0;
              result.m_backend.data._M_elems[3] = 0;
              result.m_backend.data._M_elems[4] = 0;
              result.m_backend.data._M_elems[5] = 0;
              result.m_backend.data._M_elems._24_5_ = 0;
              result.m_backend.data._M_elems[7]._1_3_ = 0;
              result.m_backend.data._M_elems._32_5_ = 0;
              result.m_backend.data._M_elems[9]._1_3_ = 0;
              result.m_backend.exp = 0;
              result.m_backend.neg = false;
              boost::multiprecision::default_ops::
              eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                        (&result.m_backend,&result_2.m_backend,
                         &scale.data.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[iVar36].m_backend);
              DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::add(pDVar29 + iVar20,iVar36,&result);
              piVar1 = classSize.data + pClass.data[iVar36];
              *piVar1 = *piVar1 + -1;
              if (*piVar1 == 0) {
                lVar27 = (long)iVar31;
                iVar31 = iVar31 + 1;
                piVar12[lVar27] = pClass.data[iVar36];
              }
              lVar34 = lVar34 + 1;
              lVar42 = lVar42 + 0x3c;
            } while (lVar34 < (pIVar10->data).
                              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .memused);
          }
          if (0 < (pIVar10->data).
                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .memused) {
            dVar43 = 0.0;
            do {
              iVar36 = pClass.data
                       [(pIVar10->data).
                        super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .m_elem[(long)dVar43].idx];
              if (0 < (this->m_classSetCols).data.
                      super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[iVar36].
                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .memused) {
                pTVar9 = (this->
                         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         )._tolerances.
                         super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                p_Var38 = (this->
                          super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          )._tolerances.
                          super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi;
                if (p_Var38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    p_Var38->_M_use_count = p_Var38->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    p_Var38->_M_use_count = p_Var38->_M_use_count + 1;
                  }
                }
                RVar45 = Tolerances::epsilon(pTVar9);
                local_478._0_4_ = cpp_dec_float_finite;
                local_478._4_4_ = 10;
                _local_4a8 = (undefined1  [16])0x0;
                local_498[0] = 0;
                local_498[1] = 0;
                uStack_490 = 0;
                uStack_48b = 0;
                local_488[0] = 0;
                local_488[1] = 0;
                local_488[2] = 0;
                local_47c = 0;
                boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                          (local_4a8,RVar45);
                auVar16 = _local_4a8;
                local_758.data._M_elems[8] = local_488[0];
                local_758.data._M_elems[9] = local_488[1];
                local_758.data._M_elems[7]._1_3_ = uStack_48b;
                local_758.data._M_elems._24_5_ = uStack_490;
                local_758.data._M_elems[4] = local_498[0];
                local_758.data._M_elems[5] = local_498[1];
                local_758.data._M_elems._0_8_ = local_4a8;
                local_758.data._M_elems[2] = auStack_4a0[0];
                local_758.data._M_elems[3] = auStack_4a0[1];
                local_758.exp = local_488[2];
                local_758.neg = (bool)local_47c;
                local_758.fpclass = (fpclass_type)local_478;
                local_758.prec_elem = local_478._4_4_;
                _local_4a8 = auVar16;
                if (p_Var38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var38);
                }
                pDVar29 = (this->m_classSetCols).data.
                          super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                iVar20 = pDVar29[iVar36].
                         super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .memused;
                if (1 < iVar20) {
                  SPxQuicksort<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>,soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::ElementCompare>
                            (pDVar29[iVar36].
                             super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             .m_elem,iVar20,(ElementCompare *)&local_758,0,true);
                }
                iVar20 = *piVar12;
                lVar34 = (long)iVar31;
                iVar31 = iVar31 + -1;
                *piVar12 = piVar12[lVar34 + -1];
                pDVar29 = (this->m_classSetCols).data.
                          super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                local_828 = dVar43;
                if (0 < pDVar29[iVar36].
                        super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .memused) {
                  pDVar2 = pDVar29 + iVar36;
                  lVar34 = 0;
                  lVar42 = 0;
                  do {
                    uVar18 = local_5cc;
                    iVar21 = local_5d0;
                    if (lVar34 != 0) {
                      pNVar7 = (pDVar2->
                               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ).m_elem;
                      pnVar28 = *(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  **)((long)(pNVar7->val).m_backend.data._M_elems + lVar34 + 0x20);
                      puVar3 = (undefined8 *)((long)(pNVar7->val).m_backend.data._M_elems + lVar34);
                      local_2b8._0_8_ = *puVar3;
                      local_2b8.data = (int *)puVar3[1];
                      pRVar5 = (Real *)((long)(pNVar7->val).m_backend.data._M_elems + lVar34 + 0x10)
                      ;
                      local_2b8.memFactor = *pRVar5;
                      RStack_2a0 = pRVar5[1];
                      local_2c8 = local_5d8;
                      auStack_2d0[1]._1_3_ = uStack_5db;
                      auStack_2d0._0_5_ = uStack_5e0;
                      local_2d8[0] = auStack_5f0[2];
                      local_2d8[1] = auStack_5f0[3];
                      local_2e8 = local_5f8;
                      auStack_2e0[0] = auStack_5f0[0];
                      auStack_2e0[1] = auStack_5f0[1];
                      local_718 = local_5c8;
                      uStack_710 = 0;
                      local_298 = pnVar28;
                      epsZero((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&local_a0,this);
                      da_perm.thesize = local_2b8.thesize;
                      da_perm.themax = local_2b8.themax;
                      da_perm.data = local_2b8.data;
                      da_perm.memFactor = local_2b8.memFactor;
                      perm = local_2e8;
                      auStack_890[0] = auStack_2e0[0];
                      auStack_890[1] = auStack_2e0[1];
                      local_888[0] = local_2d8[0];
                      local_888[1] = local_2d8[1];
                      auStack_880[0] = auStack_2d0[0];
                      auStack_880[1] = auStack_2d0[1];
                      local_878 = local_2c8;
                      local_870 = iVar21;
                      local_86c = (bool)uVar18;
                      local_868 = local_718;
                      relDiff<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
                                (&result_2,(soplex *)&da_perm,
                                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)&perm,pnVar28);
                      result.m_backend.data._M_elems._32_5_ =
                           result_2.m_backend.data._M_elems._32_5_;
                      result.m_backend.data._M_elems[9]._1_3_ =
                           result_2.m_backend.data._M_elems[9]._1_3_;
                      result.m_backend.data._M_elems[4] = result_2.m_backend.data._M_elems[4];
                      result.m_backend.data._M_elems[5] = result_2.m_backend.data._M_elems[5];
                      result.m_backend.data._M_elems._24_5_ =
                           result_2.m_backend.data._M_elems._24_5_;
                      result.m_backend.data._M_elems[7]._1_3_ =
                           result_2.m_backend.data._M_elems[7]._1_3_;
                      result.m_backend.data._M_elems[0] = result_2.m_backend.data._M_elems[0];
                      result.m_backend.data._M_elems[1] = result_2.m_backend.data._M_elems[1];
                      result.m_backend.data._M_elems[2] = result_2.m_backend.data._M_elems[2];
                      result.m_backend.data._M_elems[3] = result_2.m_backend.data._M_elems[3];
                      auVar16 = (undefined1  [16])result.m_backend.data._M_elems._0_16_;
                      result.m_backend.exp = result_2.m_backend.exp;
                      result.m_backend.neg = result_2.m_backend.neg;
                      result.m_backend.fpclass = result_2.m_backend.fpclass;
                      result.m_backend.prec_elem = result_2.m_backend.prec_elem;
                      if ((result_2.m_backend.neg == true) &&
                         (result.m_backend.data._M_elems[0] = result_2.m_backend.data._M_elems[0],
                         result.m_backend.data._M_elems[0] != 0 ||
                         result_2.m_backend.fpclass != cpp_dec_float_finite)) {
                        result.m_backend.neg = false;
                      }
                      result.m_backend.data._M_elems._0_16_ = auVar16;
                      if (((result_2.m_backend.fpclass != cpp_dec_float_NaN) &&
                          (local_a0.fpclass != cpp_dec_float_NaN)) &&
                         (iVar21 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                                   compare(&result.m_backend,&local_a0), 0 < iVar21)) {
                        iVar20 = *piVar12;
                        lVar27 = (long)iVar31;
                        iVar31 = iVar31 + -1;
                        *piVar12 = piVar12[lVar27 + -1];
                      }
                    }
                    pNVar7 = (this->m_classSetCols).data.
                             super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[iVar36].
                             super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             .m_elem;
                    pClass.data[*(int *)((long)(&pNVar7->val + 1) + lVar34)] = iVar20;
                    classSize.data[iVar20] = classSize.data[iVar20] + 1;
                    local_5d8 = *(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  **)((long)(pNVar7->val).m_backend.data._M_elems + lVar34 + 0x20);
                    puVar3 = (undefined8 *)((long)(pNVar7->val).m_backend.data._M_elems + lVar34);
                    local_5f8 = (int *)*puVar3;
                    auStack_5f0._0_8_ = puVar3[1];
                    puVar4 = (uint *)((long)(pNVar7->val).m_backend.data._M_elems + lVar34 + 0x10);
                    auStack_5f0._8_8_ = *(undefined8 *)puVar4;
                    uVar8 = *(undefined8 *)(puVar4 + 2);
                    uStack_5e0 = (undefined5)uVar8;
                    uStack_5db = (undefined3)((ulong)uVar8 >> 0x28);
                    local_5d0 = *(int *)((long)(&(pNVar7->val).m_backend.data + 1) + lVar34);
                    local_5cc = *(bool *)((long)(&(pNVar7->val).m_backend.data + 1) + lVar34 + 4U);
                    local_5c8 = *(long *)((long)(&(pNVar7->val).m_backend.data + 1) + lVar34 + 8U);
                    lVar42 = lVar42 + 1;
                    pDVar29 = (this->m_classSetCols).data.
                              super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    pDVar2 = pDVar29 + iVar36;
                    lVar34 = lVar34 + 0x3c;
                  } while (lVar42 < (pDVar2->
                                    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    ).memused);
                }
                pDVar29[iVar36].
                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .memused = 0;
                dVar43 = local_828;
              }
              dVar43 = (double)((long)dVar43 + 1);
            } while ((long)dVar43 <
                     (long)(pIVar10->data).
                           super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .memused);
          }
          dVar43 = (double)((long)local_838 + 1);
        } while ((long)dVar43 <
                 (long)(lp->
                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .set.thenum);
      }
      free(idxMem);
      idxMem = (int *)0x0;
      remCol.themax =
           (lp->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).
           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .set.thenum;
      remCol.data = (bool *)0x0;
      remCol.memFactor = 1.2;
      remCol.thesize = remCol.themax;
      if (remCol.themax < 1) {
        remCol.themax = 1;
        remCol.thesize = 0;
      }
      spx_alloc<bool*>(&remCol.data,remCol.themax);
      fixAndRemCol.themax =
           (lp->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).
           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .set.thenum;
      fixAndRemCol.data = (bool *)0x0;
      fixAndRemCol.memFactor = 1.2;
      fixAndRemCol.thesize = fixAndRemCol.themax;
      if (fixAndRemCol.themax < 1) {
        fixAndRemCol.themax = 1;
        fixAndRemCol.thesize = 0;
      }
      spx_alloc<bool*>(&fixAndRemCol.data,fixAndRemCol.themax);
      auVar16 = _DAT_003581b0;
      iVar31 = (lp->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum;
      if (0 < (long)iVar31) {
        pDVar29 = (this->m_dupCols).data.
                  super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar34 = (long)iVar31 + -1;
        auVar46._8_4_ = (int)lVar34;
        auVar46._0_8_ = lVar34;
        auVar46._12_4_ = (int)((ulong)lVar34 >> 0x20);
        lVar34 = 0;
        auVar46 = auVar46 ^ _DAT_003581b0;
        auVar47 = _DAT_00358190;
        auVar48 = _DAT_003581a0;
        do {
          auVar49 = auVar48 ^ auVar16;
          iVar36 = auVar46._4_4_;
          if ((bool)(~(auVar49._4_4_ == iVar36 && auVar46._0_4_ < auVar49._0_4_ ||
                      iVar36 < auVar49._4_4_) & 1)) {
            *(undefined4 *)
             ((long)&(pDVar29->
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).memused + lVar34) = 0;
          }
          if ((auVar49._12_4_ != auVar46._12_4_ || auVar49._8_4_ <= auVar46._8_4_) &&
              auVar49._12_4_ <= auVar46._12_4_) {
            *(undefined4 *)
             ((long)&pDVar29[1].
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .memused + lVar34) = 0;
          }
          auVar49 = auVar47 ^ auVar16;
          iVar20 = auVar49._4_4_;
          if (iVar20 <= iVar36 && (iVar20 != iVar36 || auVar49._0_4_ <= auVar46._0_4_)) {
            *(undefined4 *)
             ((long)&pDVar29[2].
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .memused + lVar34) = 0;
            *(undefined4 *)
             ((long)&pDVar29[3].
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .memused + lVar34) = 0;
          }
          lVar42 = auVar48._8_8_;
          auVar48._0_8_ = auVar48._0_8_ + 4;
          auVar48._8_8_ = lVar42 + 4;
          lVar42 = auVar47._8_8_;
          auVar47._0_8_ = auVar47._0_8_ + 4;
          auVar47._8_8_ = lVar42 + 4;
          lVar34 = lVar34 + 0x80;
        } while ((ulong)(iVar31 + 3U >> 2) << 7 != lVar34);
      }
      if (0 < (lp->
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.thenum) {
        lVar34 = 0;
        do {
          remCol.data[lVar34] = false;
          fixAndRemCol.data[lVar34] = false;
          iVar31 = pClass.data[lVar34];
          pDVar29 = (this->m_dupCols).data.
                    super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          result.m_backend.fpclass = cpp_dec_float_finite;
          result.m_backend.prec_elem = 10;
          result.m_backend.data._M_elems[0] = 0;
          result.m_backend.data._M_elems[1] = 0;
          result.m_backend.data._M_elems[2] = 0;
          result.m_backend.data._M_elems[3] = 0;
          result.m_backend.data._M_elems[4] = 0;
          result.m_backend.data._M_elems[5] = 0;
          result.m_backend.data._M_elems._24_5_ = 0;
          result.m_backend.data._M_elems[7]._1_3_ = 0;
          result.m_backend.data._M_elems._32_5_ = 0;
          result.m_backend.data._M_elems[9]._1_3_ = 0;
          result.m_backend.exp = 0;
          result.m_backend.neg = false;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&result,0.0);
          DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::add(pDVar29 + iVar31,(int)lVar34,&result);
          lVar34 = lVar34 + 1;
        } while (lVar34 < (lp->
                          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .set.thenum);
      }
      m_perm_empty.data = (int *)0x0;
      m_perm_empty.memFactor = 1.2;
      m_perm_empty.thesize = 0;
      m_perm_empty.themax = 1;
      spx_alloc<int*>(&m_perm_empty.data,1);
      iVar31 = (lp->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum;
      bVar35 = 0 < iVar31;
      if (iVar31 < 1) {
        uVar40 = 0;
      }
      else {
        local_858 = &this->m_hist;
        pdVar22 = (double *)__tls_get_addr(&PTR_003b6b60);
        local_838 = *pdVar22;
        uStack_830 = 0;
        local_828 = -local_838;
        uStack_820 = 0x8000000000000000;
        lVar34 = 0;
        uVar40 = 0;
        do {
          pDVar29 = (this->m_dupCols).data.
                    super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_810 = lVar34;
          if ((1 < pDVar29[lVar34].
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .memused) &&
             ((lp->
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.theitem
              [(lp->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thekey
               [(pDVar29[lVar34].
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .m_elem)->idx].idx].data.
              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .memused != 1)) {
            if ((uVar40 & 1) == 0) {
              pDVar23 = (DuplicateColsPS *)operator_new(0x168);
              local_118 = 0xa00000000;
              local_148 = 0;
              uStack_140 = 0;
              local_138 = 0;
              uStack_130 = 0;
              uStack_12b = 0;
              uStack_128 = 0;
              uStack_123 = 0;
              boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                        ((cpp_dec_float<50u,int,void> *)&local_148,1.0);
              DataArray<int>::DataArray(&local_5c0,&m_perm_empty);
              local_658.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (this->
                   super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
              local_658.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi =
                   (this->
                   super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
              if (local_658.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  (local_658.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (local_658.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  (local_658.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (local_658.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi)->_M_use_count + 1;
                }
              }
              DuplicateColsPS::DuplicateColsPS
                        (pDVar23,lp,0,0,
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_148,&local_5c0,&local_658,true,false);
              result.m_backend.data._M_elems._0_8_ = pDVar23;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
              __shared_count<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::DuplicateColsPS*>
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                         (result.m_backend.data._M_elems + 2),pDVar23);
              if (local_658.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_658.
                           super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
              }
              if (local_5c0.data != (int *)0x0) {
                free(local_5c0.data);
                local_5c0.data = (int *)0x0;
              }
              std::
              vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
              ::push_back(&local_858->data,(value_type *)&result);
              if (result.m_backend.data._M_elems._8_8_ != 0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           result.m_backend.data._M_elems._8_8_);
              }
              uVar40 = CONCAT71((int7)((ulong)&local_5c0 >> 8),1);
            }
            iVar31 = (this->m_dupCols).data.
                     super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar34].
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .memused;
            bVar30 = 0 < iVar31;
            if (0 < iVar31) {
              local_718 = 0;
              local_700 = uVar40;
              do {
                pDVar29 = (this->m_dupCols).data.
                          super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                if (0 < pDVar29[lVar34].
                        super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .memused) {
                  pDVar29 = pDVar29 + lVar34;
                  local_6c8 = 0x38;
                  lVar42 = 0;
                  do {
                    if (local_718 != lVar42) {
                      pNVar7 = (pDVar29->
                               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ).m_elem;
                      iVar31 = pNVar7[local_718].idx;
                      lVar27 = (long)iVar31;
                      if (remCol.data[lVar27] == false) {
                        iVar36 = *(int *)((long)(pNVar7->val).m_backend.data._M_elems + local_6c8);
                        lVar32 = (long)iVar36;
                        if (remCol.data[lVar32] == false) {
                          pnVar41 = (lp->
                                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    ).object.val.
                                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start;
                          local_2f8._0_8_ =
                               *(undefined8 *)(pnVar41[lVar27].m_backend.data._M_elems + 8);
                          local_318 = pnVar41[lVar27].m_backend.data._M_elems[0];
                          auStack_310 = *(uint (*) [2])(pnVar41[lVar27].m_backend.data._M_elems + 2)
                          ;
                          puVar4 = pnVar41[lVar27].m_backend.data._M_elems + 4;
                          local_308 = *(uint (*) [2])puVar4;
                          auStack_300 = *(uint (*) [2])(puVar4 + 2);
                          iVar20 = pnVar41[lVar27].m_backend.exp;
                          bVar6 = pnVar41[lVar27].m_backend.neg;
                          uVar8._0_4_ = pnVar41[lVar27].m_backend.fpclass;
                          uVar8._4_4_ = pnVar41[lVar27].m_backend.prec_elem;
                          local_758.data._M_elems._32_8_ =
                               *(undefined8 *)(pnVar41[lVar32].m_backend.data._M_elems + 8);
                          local_758.data._M_elems._0_8_ =
                               *(undefined8 *)&pnVar41[lVar32].m_backend.data;
                          local_758.data._M_elems._8_8_ =
                               *(undefined8 *)(pnVar41[lVar32].m_backend.data._M_elems + 2);
                          puVar4 = pnVar41[lVar32].m_backend.data._M_elems + 4;
                          local_758.data._M_elems._16_8_ = *(undefined8 *)puVar4;
                          local_758.data._M_elems._24_8_ = *(undefined8 *)(puVar4 + 2);
                          local_758.exp = pnVar41[lVar32].m_backend.exp;
                          local_758.neg = pnVar41[lVar32].m_backend.neg;
                          local_758.fpclass = pnVar41[lVar32].m_backend.fpclass;
                          local_758.prec_elem = pnVar41[lVar32].m_backend.prec_elem;
                          factor.m_backend.fpclass = cpp_dec_float_finite;
                          factor.m_backend.prec_elem = 10;
                          factor.m_backend.data._M_elems[0] = 0;
                          factor.m_backend.data._M_elems[1] = 0;
                          factor.m_backend.data._M_elems[2] = 0;
                          factor.m_backend.data._M_elems[3] = 0;
                          factor.m_backend.data._M_elems[4] = 0;
                          factor.m_backend.data._M_elems[5] = 0;
                          factor.m_backend.data._M_elems._24_5_ = 0;
                          factor.m_backend.data._M_elems[7]._1_3_ = 0;
                          factor.m_backend.data._M_elems._32_5_ = 0;
                          factor.m_backend.data._M_elems[9]._1_3_ = 0;
                          factor.m_backend.exp = 0;
                          factor.m_backend.neg = false;
                          boost::multiprecision::default_ops::
                          eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                                    (&factor.m_backend,
                                     &scale.data.
                                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[lVar27].m_backend,
                                     &scale.data.
                                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[lVar32].m_backend);
                          result_2.m_backend.fpclass = cpp_dec_float_finite;
                          result_2.m_backend.prec_elem = 10;
                          result_2.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                          result_2.m_backend.data._M_elems[4] = 0;
                          result_2.m_backend.data._M_elems[5] = 0;
                          result_2.m_backend.data._M_elems._24_5_ = 0;
                          result_2.m_backend.data._M_elems[7]._1_3_ = 0;
                          result_2.m_backend.data._M_elems._32_5_ = 0;
                          result_2.m_backend.data._M_elems[9]._1_3_ = 0;
                          result_2.m_backend.exp = 0;
                          result_2.m_backend.neg = false;
                          pcVar37 = &local_758;
                          if (&result_2.m_backend !=
                              &scale.data.
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[lVar27].m_backend) {
                            result_2.m_backend.data._M_elems._32_5_ = local_758.data._M_elems._32_5_
                            ;
                            result_2.m_backend.data._M_elems[9]._1_3_ =
                                 local_758.data._M_elems[9]._1_3_;
                            result_2.m_backend.data._M_elems[4] = local_758.data._M_elems[4];
                            result_2.m_backend.data._M_elems[5] = local_758.data._M_elems[5];
                            result_2.m_backend.data._M_elems._24_5_ = local_758.data._M_elems._24_5_
                            ;
                            result_2.m_backend.data._M_elems[7]._1_3_ =
                                 local_758.data._M_elems[7]._1_3_;
                            result_2.m_backend.data._M_elems[2] = local_758.data._M_elems[2];
                            result_2.m_backend.data._M_elems[3] = local_758.data._M_elems[3];
                            result_2.m_backend.data._M_elems[0] = local_758.data._M_elems[0];
                            result_2.m_backend.data._M_elems[1] = local_758.data._M_elems[1];
                            result_2.m_backend.exp = local_758.exp;
                            result_2.m_backend.neg = local_758.neg;
                            result_2.m_backend.fpclass = local_758.fpclass;
                            result_2.m_backend.prec_elem = local_758.prec_elem;
                            pcVar37 = &scale.data.
                                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[lVar27].m_backend;
                          }
                          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                                    (&result_2.m_backend,pcVar37);
                          result.m_backend.fpclass = cpp_dec_float_finite;
                          result.m_backend.prec_elem = 10;
                          result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                          result.m_backend.data._M_elems[4] = 0;
                          result.m_backend.data._M_elems[5] = 0;
                          result.m_backend.data._M_elems._24_5_ = 0;
                          result.m_backend.data._M_elems[7]._1_3_ = 0;
                          result.m_backend.data._M_elems._32_5_ = 0;
                          result.m_backend.data._M_elems[9]._1_3_ = 0;
                          result.m_backend.exp = 0;
                          result.m_backend.neg = false;
                          boost::multiprecision::default_ops::
                          eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                                    (&result.m_backend,&result_2.m_backend,
                                     &scale.data.
                                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[lVar32].m_backend);
                          result_3.m_backend.data._M_elems[8] = local_2f8[0];
                          result_3.m_backend.data._M_elems[9] = local_2f8[1];
                          result_3.m_backend.data._M_elems[4] = local_308[0];
                          result_3.m_backend.data._M_elems[5] = local_308[1];
                          result_3.m_backend.data._M_elems[6] = auStack_300[0];
                          result_3.m_backend.data._M_elems[7] = auStack_300[1];
                          result_3.m_backend.data._M_elems[0] = local_318[0];
                          result_3.m_backend.data._M_elems[1] = local_318[1];
                          result_3.m_backend.data._M_elems[2] = auStack_310[0];
                          result_3.m_backend.data._M_elems[3] = auStack_310[1];
                          result_3.m_backend.exp = iVar20;
                          result_3.m_backend.neg = bVar6;
                          result_3.m_backend._48_8_ = uVar8;
                          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                                    (&result_3.m_backend,&result.m_backend);
                          uVar8 = result_3.m_backend._48_8_;
                          bVar6 = result_3.m_backend.neg;
                          iVar20 = result_3.m_backend.exp;
                          local_348[0] = result_3.m_backend.data._M_elems[0];
                          local_348[1] = result_3.m_backend.data._M_elems[1];
                          auStack_340[0] = result_3.m_backend.data._M_elems[2];
                          auStack_340[1] = result_3.m_backend.data._M_elems[3];
                          local_338[0] = result_3.m_backend.data._M_elems[4];
                          local_338[1] = result_3.m_backend.data._M_elems[5];
                          auStack_330[0] = result_3.m_backend.data._M_elems[6];
                          auStack_330[1] = result_3.m_backend.data._M_elems[7];
                          local_328[0] = result_3.m_backend.data._M_elems[8];
                          local_328[1] = result_3.m_backend.data._M_elems[9];
                          epsZero((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)&local_d8,this);
                          uVar17 = result_3.m_backend._48_8_;
                          result.m_backend.data._M_elems._32_5_ = SUB85(local_328._0_8_,0);
                          result.m_backend.data._M_elems[9]._1_3_ = SUB83(local_328._0_8_,5);
                          result.m_backend.data._M_elems[4] = local_338[0];
                          result.m_backend.data._M_elems[5] = local_338[1];
                          result.m_backend.data._M_elems._24_5_ = auStack_330._0_5_;
                          result.m_backend.data._M_elems[7]._1_3_ = auStack_330[1]._1_3_;
                          result.m_backend.data._M_elems[2] = auStack_340[0];
                          result.m_backend.data._M_elems[3] = auStack_340[1];
                          result.m_backend.data._M_elems[0] = local_348[0];
                          result.m_backend.data._M_elems[1] = local_348[1];
                          auVar16 = (undefined1  [16])result.m_backend.data._M_elems._0_16_;
                          result.m_backend.exp = iVar20;
                          result.m_backend.neg = bVar6;
                          local_938 = (fpclass_type)uVar8;
                          result_3.m_backend.fpclass = (fpclass_type)uVar8;
                          result_3.m_backend.prec_elem = SUB84(uVar8,4);
                          result.m_backend.fpclass = result_3.m_backend.fpclass;
                          result.m_backend.prec_elem = result_3.m_backend.prec_elem;
                          if ((bVar6 != false) &&
                             (result.m_backend.data._M_elems[0] = local_348[0],
                             result.m_backend.data._M_elems[0] != 0 ||
                             local_938 != cpp_dec_float_finite)) {
                            result.m_backend.neg = (bool)(bVar6 ^ 1);
                          }
                          result.m_backend.data._M_elems._0_16_ = auVar16;
                          result_3.m_backend._48_8_ = uVar17;
                          if (((local_938 == cpp_dec_float_NaN) ||
                              (local_d8.fpclass == cpp_dec_float_NaN)) ||
                             (iVar20 = boost::multiprecision::backends::
                                       cpp_dec_float<50U,_int,_void>::compare
                                                 (&result.m_backend,&local_d8), 0 < iVar20)) {
                            pcVar37 = &(lp->
                                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                       ).low.val.
                                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[lVar32].m_backend;
                            ::soplex::infinity::__tls_init();
                            result.m_backend.fpclass = cpp_dec_float_finite;
                            result.m_backend.prec_elem = 10;
                            result.m_backend.data._M_elems[0] = 0;
                            result.m_backend.data._M_elems[1] = 0;
                            result.m_backend.data._M_elems[2] = 0;
                            result.m_backend.data._M_elems[3] = 0;
                            result.m_backend.data._M_elems[4] = 0;
                            result.m_backend.data._M_elems[5] = 0;
                            result.m_backend.data._M_elems._24_5_ = 0;
                            result.m_backend.data._M_elems[7]._1_3_ = 0;
                            result.m_backend.data._M_elems._32_5_ = 0;
                            result.m_backend.data._M_elems[9]._1_3_ = 0;
                            result.m_backend.exp = 0;
                            result.m_backend.neg = false;
                            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                                      ((cpp_dec_float<50u,int,void> *)&result,local_828);
                            if (((pcVar37->fpclass == cpp_dec_float_NaN) ||
                                (result.m_backend.fpclass == cpp_dec_float_NaN)) ||
                               (iVar36 = boost::multiprecision::backends::
                                         cpp_dec_float<50U,_int,_void>::compare
                                                   (pcVar37,&result.m_backend), 0 < iVar36)) {
                              pcVar37 = &(lp->
                                         super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                         ).up.val.
                                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[lVar32].m_backend
                              ;
                              ::soplex::infinity::__tls_init();
                              result.m_backend.fpclass = cpp_dec_float_finite;
                              result.m_backend.prec_elem = 10;
                              result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                              result.m_backend.data._M_elems[4] = 0;
                              result.m_backend.data._M_elems[5] = 0;
                              result.m_backend.data._M_elems._24_5_ = 0;
                              result.m_backend.data._M_elems[7]._1_3_ = 0;
                              result.m_backend.data._M_elems._32_5_ = 0;
                              result.m_backend.data._M_elems[9]._1_3_ = 0;
                              result.m_backend.exp = 0;
                              result.m_backend.neg = false;
                              boost::multiprecision::backends::cpp_dec_float<50u,int,void>::
                              operator=((cpp_dec_float<50u,int,void> *)&result,local_838);
                              if (((pcVar37->fpclass != cpp_dec_float_NaN) &&
                                  (result.m_backend.fpclass != cpp_dec_float_NaN)) &&
                                 (iVar36 = boost::multiprecision::backends::
                                           cpp_dec_float<50U,_int,_void>::compare
                                                     (pcVar37,&result.m_backend), -1 < iVar36)) {
                                if (factor.m_backend.fpclass == cpp_dec_float_NaN) {
LAB_00311391:
                                  if (factor.m_backend.fpclass != cpp_dec_float_NaN) {
                                    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                                    cpp_dec_float<long_long>(&result.m_backend,0,(type *)0x0);
                                    iVar36 = boost::multiprecision::backends::
                                             cpp_dec_float<50U,_int,_void>::compare
                                                       (&factor.m_backend,&result.m_backend);
                                    if ((0 < iVar36) &&
                                       (result_3.m_backend.fpclass != cpp_dec_float_NaN)) {
                                      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>
                                      ::cpp_dec_float<long_long>(&result.m_backend,0,(type *)0x0);
                                      iVar36 = boost::multiprecision::backends::
                                               cpp_dec_float<50U,_int,_void>::compare
                                                         (&result_3.m_backend,&result.m_backend);
                                      if (iVar36 < 0) {
                                        pcVar37 = &(lp->
                                                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                  ).low.val.
                                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[lVar27].
                                                  m_backend;
                                        ::soplex::infinity::__tls_init();
                                        result.m_backend.fpclass = cpp_dec_float_finite;
                                        result.m_backend.prec_elem = 10;
                                        result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                                        result.m_backend.data._M_elems[4] = 0;
                                        result.m_backend.data._M_elems[5] = 0;
                                        result.m_backend.data._M_elems._24_5_ = 0;
                                        result.m_backend.data._M_elems[7]._1_3_ = 0;
                                        result.m_backend.data._M_elems._32_5_ = 0;
                                        result.m_backend.data._M_elems[9]._1_3_ = 0;
                                        result.m_backend.exp = 0;
                                        result.m_backend.neg = false;
                                        boost::multiprecision::backends::cpp_dec_float<50u,int,void>
                                        ::operator=((cpp_dec_float<50u,int,void> *)&result,local_828
                                                   );
                                        if (((pcVar37->fpclass != cpp_dec_float_NaN) &&
                                            (result.m_backend.fpclass != cpp_dec_float_NaN)) &&
                                           (iVar36 = boost::multiprecision::backends::
                                                     cpp_dec_float<50U,_int,_void>::compare
                                                               (pcVar37,&result.m_backend),
                                           iVar36 < 1)) goto LAB_0031331f;
                                        pnVar41 = (lp->
                                                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                  ).low.val.
                                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                        pFVar24 = (FixBoundsPS *)operator_new(0x30);
                                        local_288.m_backend.data._M_elems._32_8_ =
                                             *(undefined8 *)
                                              (pnVar41[lVar27].m_backend.data._M_elems + 8);
                                        local_288.m_backend.data._M_elems._0_8_ =
                                             *(undefined8 *)&pnVar41[lVar27].m_backend.data;
                                        local_288.m_backend.data._M_elems._8_8_ =
                                             *(undefined8 *)
                                              (pnVar41[lVar27].m_backend.data._M_elems + 2);
                                        puVar4 = pnVar41[lVar27].m_backend.data._M_elems + 4;
                                        local_288.m_backend.data._M_elems._16_8_ =
                                             *(undefined8 *)puVar4;
                                        local_288.m_backend.data._M_elems._24_8_ =
                                             *(undefined8 *)(puVar4 + 2);
                                        local_288.m_backend.exp = pnVar41[lVar27].m_backend.exp;
                                        local_288.m_backend.neg = pnVar41[lVar27].m_backend.neg;
                                        local_288.m_backend.fpclass =
                                             pnVar41[lVar27].m_backend.fpclass;
                                        local_288.m_backend.prec_elem =
                                             pnVar41[lVar27].m_backend.prec_elem;
                                        local_6a8.
                                        super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr = (this->
                                                  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                  )._tolerances.
                                                  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr;
                                        local_6a8.
                                        super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount._M_pi =
                                             (this->
                                             super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                             )._tolerances.
                                             super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_refcount._M_pi;
                                        if (local_6a8.
                                            super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_refcount._M_pi !=
                                            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                          if (__libc_single_threaded == '\0') {
                                            LOCK();
                                            (local_6a8.
                                             super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_refcount._M_pi)->_M_use_count =
                                                 (local_6a8.
                                                  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi)->_M_use_count + 1;
                                            UNLOCK();
                                          }
                                          else {
                                            (local_6a8.
                                             super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_refcount._M_pi)->_M_use_count =
                                                 (local_6a8.
                                                  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi)->_M_use_count + 1;
                                          }
                                        }
                                        FixBoundsPS::FixBoundsPS
                                                  (pFVar24,lp,iVar31,&local_288,&local_6a8);
                                        result.m_backend.data._M_elems._0_8_ = pFVar24;
                                        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                        __shared_count<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::FixBoundsPS*>
                                                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                                   (result.m_backend.data._M_elems + 2),pFVar24);
                                        if (local_6a8.
                                            super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_refcount._M_pi !=
                                            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                          _M_release(local_6a8.
                                                                                                          
                                                  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi);
                                        }
                                        std::
                                        vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
                                        ::push_back(&local_858->data,(value_type *)&result);
                                        (*(lp->
                                          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                          ).
                                          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                          .
                                          super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                          ._vptr_ClassArray[0x2d])
                                                  (lp,lVar27,
                                                   (lp->
                                                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                  ).low.val.
                                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + lVar27
                                                  ,0);
                                        goto joined_r0x00312e5d;
                                      }
                                    }
                                  }
                                }
                                else {
                                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                                  cpp_dec_float<long_long>(&result.m_backend,0,(type *)0x0);
                                  iVar36 = boost::multiprecision::backends::
                                           cpp_dec_float<50U,_int,_void>::compare
                                                     (&factor.m_backend,&result.m_backend);
                                  if ((-1 < iVar36) ||
                                     (result_3.m_backend.fpclass == cpp_dec_float_NaN))
                                  goto LAB_00311391;
                                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                                  cpp_dec_float<long_long>(&result.m_backend,0,(type *)0x0);
                                  iVar36 = boost::multiprecision::backends::
                                           cpp_dec_float<50U,_int,_void>::compare
                                                     (&result_3.m_backend,&result.m_backend);
                                  if (iVar36 < 1) goto LAB_00311391;
                                  pcVar37 = &(lp->
                                             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                             ).up.val.
                                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start[lVar27].
                                             m_backend;
                                  ::soplex::infinity::__tls_init();
                                  result.m_backend.fpclass = cpp_dec_float_finite;
                                  result.m_backend.prec_elem = 10;
                                  result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                                  result.m_backend.data._M_elems[4] = 0;
                                  result.m_backend.data._M_elems[5] = 0;
                                  result.m_backend.data._M_elems._24_5_ = 0;
                                  result.m_backend.data._M_elems[7]._1_3_ = 0;
                                  result.m_backend.data._M_elems._32_5_ = 0;
                                  result.m_backend.data._M_elems[9]._1_3_ = 0;
                                  result.m_backend.exp = 0;
                                  result.m_backend.neg = false;
                                  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::
                                  operator=((cpp_dec_float<50u,int,void> *)&result,local_838);
                                  if (((pcVar37->fpclass != cpp_dec_float_NaN) &&
                                      (result.m_backend.fpclass != cpp_dec_float_NaN)) &&
                                     (iVar36 = boost::multiprecision::backends::
                                               cpp_dec_float<50U,_int,_void>::compare
                                                         (pcVar37,&result.m_backend), -1 < iVar36))
                                  goto LAB_0031331f;
                                  pnVar41 = (lp->
                                            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                            ).up.val.
                                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start;
                                  pFVar24 = (FixBoundsPS *)operator_new(0x30);
                                  local_248.m_backend.data._M_elems._32_8_ =
                                       *(undefined8 *)(pnVar41[lVar27].m_backend.data._M_elems + 8);
                                  local_248.m_backend.data._M_elems._0_8_ =
                                       *(undefined8 *)&pnVar41[lVar27].m_backend.data;
                                  local_248.m_backend.data._M_elems._8_8_ =
                                       *(undefined8 *)(pnVar41[lVar27].m_backend.data._M_elems + 2);
                                  puVar4 = pnVar41[lVar27].m_backend.data._M_elems + 4;
                                  local_248.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar4;
                                  local_248.m_backend.data._M_elems._24_8_ =
                                       *(undefined8 *)(puVar4 + 2);
                                  local_248.m_backend.exp = pnVar41[lVar27].m_backend.exp;
                                  local_248.m_backend.neg = pnVar41[lVar27].m_backend.neg;
                                  local_248.m_backend.fpclass = pnVar41[lVar27].m_backend.fpclass;
                                  local_248.m_backend.prec_elem =
                                       pnVar41[lVar27].m_backend.prec_elem;
                                  local_698.
                                  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr = (this->
                                            super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                            )._tolerances.
                                            super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_ptr;
                                  local_698.
                                  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi =
                                       (this->
                                       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                       )._tolerances.
                                       super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_refcount._M_pi;
                                  if (local_698.
                                      super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount._M_pi !=
                                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                    if (__libc_single_threaded == '\0') {
                                      LOCK();
                                      (local_698.
                                       super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_refcount._M_pi)->_M_use_count =
                                           (local_698.
                                            super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_refcount._M_pi)->_M_use_count + 1;
                                      UNLOCK();
                                    }
                                    else {
                                      (local_698.
                                       super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_refcount._M_pi)->_M_use_count =
                                           (local_698.
                                            super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_refcount._M_pi)->_M_use_count + 1;
                                    }
                                  }
                                  FixBoundsPS::FixBoundsPS(pFVar24,lp,iVar31,&local_248,&local_698);
                                  result.m_backend.data._M_elems._0_8_ = pFVar24;
                                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                  __shared_count<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::FixBoundsPS*>
                                            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                             (result.m_backend.data._M_elems + 2),pFVar24);
                                  if (local_698.
                                      super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount._M_pi !=
                                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                              (local_698.
                                               super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                               ._M_refcount._M_pi);
                                  }
                                  std::
                                  vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
                                  ::push_back(&local_858->data,(value_type *)&result);
                                  (*(lp->
                                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    ).
                                    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    .
                                    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                    ._vptr_ClassArray[0x2a])
                                            (lp,lVar27,
                                             (lp->
                                             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                             ).up.val.
                                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start + lVar27,0);
joined_r0x00312e5d:
                                  p_Var38 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                            result.m_backend.data._M_elems._8_8_;
                                  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                      result.m_backend.data._M_elems._8_8_ !=
                                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
                                  goto LAB_00312ef8;
                                }
                              }
                            }
                            else if (factor.m_backend.fpclass == cpp_dec_float_NaN) {
LAB_0031152e:
                              if (factor.m_backend.fpclass != cpp_dec_float_NaN) {
                                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                                cpp_dec_float<long_long>(&result.m_backend,0,(type *)0x0);
                                iVar36 = boost::multiprecision::backends::
                                         cpp_dec_float<50U,_int,_void>::compare
                                                   (&factor.m_backend,&result.m_backend);
                                if ((iVar36 < 0) &&
                                   (result_3.m_backend.fpclass != cpp_dec_float_NaN)) {
                                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                                  cpp_dec_float<long_long>(&result.m_backend,0,(type *)0x0);
                                  iVar36 = boost::multiprecision::backends::
                                           cpp_dec_float<50U,_int,_void>::compare
                                                     (&result_3.m_backend,&result.m_backend);
                                  if (iVar36 < 0) {
                                    pcVar37 = &(lp->
                                               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                               ).low.val.
                                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start[lVar27].
                                               m_backend;
                                    ::soplex::infinity::__tls_init();
                                    result.m_backend.fpclass = cpp_dec_float_finite;
                                    result.m_backend.prec_elem = 10;
                                    result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                                    result.m_backend.data._M_elems[4] = 0;
                                    result.m_backend.data._M_elems[5] = 0;
                                    result.m_backend.data._M_elems._24_5_ = 0;
                                    result.m_backend.data._M_elems[7]._1_3_ = 0;
                                    result.m_backend.data._M_elems._32_5_ = 0;
                                    result.m_backend.data._M_elems[9]._1_3_ = 0;
                                    result.m_backend.exp = 0;
                                    result.m_backend.neg = false;
                                    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::
                                    operator=((cpp_dec_float<50u,int,void> *)&result,local_828);
                                    if (((pcVar37->fpclass != cpp_dec_float_NaN) &&
                                        (result.m_backend.fpclass != cpp_dec_float_NaN)) &&
                                       (iVar36 = boost::multiprecision::backends::
                                                 cpp_dec_float<50U,_int,_void>::compare
                                                           (pcVar37,&result.m_backend), iVar36 < 1))
                                    goto LAB_0031331f;
                                    pnVar41 = (lp->
                                              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                              ).low.val.
                                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start;
                                    pFVar24 = (FixBoundsPS *)operator_new(0x30);
                                    local_208.m_backend.data._M_elems._32_8_ =
                                         *(undefined8 *)
                                          (pnVar41[lVar27].m_backend.data._M_elems + 8);
                                    local_208.m_backend.data._M_elems._0_8_ =
                                         *(undefined8 *)&pnVar41[lVar27].m_backend.data;
                                    local_208.m_backend.data._M_elems._8_8_ =
                                         *(undefined8 *)
                                          (pnVar41[lVar27].m_backend.data._M_elems + 2);
                                    puVar4 = pnVar41[lVar27].m_backend.data._M_elems + 4;
                                    local_208.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar4
                                    ;
                                    local_208.m_backend.data._M_elems._24_8_ =
                                         *(undefined8 *)(puVar4 + 2);
                                    local_208.m_backend.exp = pnVar41[lVar27].m_backend.exp;
                                    local_208.m_backend.neg = pnVar41[lVar27].m_backend.neg;
                                    local_208.m_backend.fpclass = pnVar41[lVar27].m_backend.fpclass;
                                    local_208.m_backend.prec_elem =
                                         pnVar41[lVar27].m_backend.prec_elem;
                                    local_688.
                                    super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr = (this->
                                              super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                              )._tolerances.
                                              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_ptr;
                                    local_688.
                                    super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi =
                                         (this->
                                         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                         )._tolerances.
                                         super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_refcount._M_pi;
                                    if (local_688.
                                        super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount._M_pi !=
                                        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                      if (__libc_single_threaded == '\0') {
                                        LOCK();
                                        (local_688.
                                         super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_refcount._M_pi)->_M_use_count =
                                             (local_688.
                                              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_refcount._M_pi)->_M_use_count + 1;
                                        UNLOCK();
                                      }
                                      else {
                                        (local_688.
                                         super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_refcount._M_pi)->_M_use_count =
                                             (local_688.
                                              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_refcount._M_pi)->_M_use_count + 1;
                                      }
                                    }
                                    FixBoundsPS::FixBoundsPS
                                              (pFVar24,lp,iVar31,&local_208,&local_688);
                                    result.m_backend.data._M_elems._0_8_ = pFVar24;
                                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                    __shared_count<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::FixBoundsPS*>
                                              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                               (result.m_backend.data._M_elems + 2),pFVar24);
                                    if (local_688.
                                        super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount._M_pi !=
                                        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                                (local_688.
                                                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                                 ._M_refcount._M_pi);
                                    }
                                    std::
                                    vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
                                    ::push_back(&local_858->data,(value_type *)&result);
                                    (*(lp->
                                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      ).
                                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      .
                                      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                      ._vptr_ClassArray[0x2d])
                                              (lp,lVar27,
                                               (lp->
                                               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                               ).low.val.
                                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start + lVar27,0)
                                    ;
                                    goto joined_r0x00312e5d;
                                  }
                                }
                              }
                            }
                            else {
                              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                              cpp_dec_float<long_long>(&result.m_backend,0,(type *)0x0);
                              iVar36 = boost::multiprecision::backends::
                                       cpp_dec_float<50U,_int,_void>::compare
                                                 (&factor.m_backend,&result.m_backend);
                              if ((iVar36 < 1) || (result_3.m_backend.fpclass == cpp_dec_float_NaN))
                              goto LAB_0031152e;
                              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                              cpp_dec_float<long_long>(&result.m_backend,0,(type *)0x0);
                              iVar36 = boost::multiprecision::backends::
                                       cpp_dec_float<50U,_int,_void>::compare
                                                 (&result_3.m_backend,&result.m_backend);
                              if (iVar36 < 1) goto LAB_0031152e;
                              pcVar37 = &(lp->
                                         super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                         ).up.val.
                                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[lVar27].m_backend
                              ;
                              ::soplex::infinity::__tls_init();
                              result.m_backend.fpclass = cpp_dec_float_finite;
                              result.m_backend.prec_elem = 10;
                              result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                              result.m_backend.data._M_elems[4] = 0;
                              result.m_backend.data._M_elems[5] = 0;
                              result.m_backend.data._M_elems._24_5_ = 0;
                              result.m_backend.data._M_elems[7]._1_3_ = 0;
                              result.m_backend.data._M_elems._32_5_ = 0;
                              result.m_backend.data._M_elems[9]._1_3_ = 0;
                              result.m_backend.exp = 0;
                              result.m_backend.neg = false;
                              boost::multiprecision::backends::cpp_dec_float<50u,int,void>::
                              operator=((cpp_dec_float<50u,int,void> *)&result,local_838);
                              if (((pcVar37->fpclass != cpp_dec_float_NaN) &&
                                  (result.m_backend.fpclass != cpp_dec_float_NaN)) &&
                                 (iVar36 = boost::multiprecision::backends::
                                           cpp_dec_float<50U,_int,_void>::compare
                                                     (pcVar37,&result.m_backend), -1 < iVar36)) {
LAB_0031331f:
                                uVar40 = local_700;
                                if (!bVar30) goto LAB_00313306;
                                goto LAB_00313350;
                              }
                              pnVar41 = (lp->
                                        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        ).up.val.
                                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start;
                              pFVar24 = (FixBoundsPS *)operator_new(0x30);
                              local_1c8.m_backend.data._M_elems._32_8_ =
                                   *(undefined8 *)(pnVar41[lVar27].m_backend.data._M_elems + 8);
                              local_1c8.m_backend.data._M_elems._0_8_ =
                                   *(undefined8 *)&pnVar41[lVar27].m_backend.data;
                              local_1c8.m_backend.data._M_elems._8_8_ =
                                   *(undefined8 *)(pnVar41[lVar27].m_backend.data._M_elems + 2);
                              puVar4 = pnVar41[lVar27].m_backend.data._M_elems + 4;
                              local_1c8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar4;
                              local_1c8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar4 + 2)
                              ;
                              local_1c8.m_backend.exp = pnVar41[lVar27].m_backend.exp;
                              local_1c8.m_backend.neg = pnVar41[lVar27].m_backend.neg;
                              local_1c8.m_backend.fpclass = pnVar41[lVar27].m_backend.fpclass;
                              local_1c8.m_backend.prec_elem = pnVar41[lVar27].m_backend.prec_elem;
                              local_678.
                              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr = (this->
                                       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                       )._tolerances.
                                       super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr;
                              local_678.
                              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi =
                                   (this->
                                   super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   )._tolerances.
                                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount._M_pi;
                              if (local_678.
                                  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi !=
                                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                if (__libc_single_threaded == '\0') {
                                  LOCK();
                                  (local_678.
                                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount._M_pi)->_M_use_count =
                                       (local_678.
                                        super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount._M_pi)->_M_use_count + 1;
                                  UNLOCK();
                                }
                                else {
                                  (local_678.
                                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount._M_pi)->_M_use_count =
                                       (local_678.
                                        super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount._M_pi)->_M_use_count + 1;
                                }
                              }
                              FixBoundsPS::FixBoundsPS(pFVar24,lp,iVar31,&local_1c8,&local_678);
                              result.m_backend.data._M_elems._0_8_ = pFVar24;
                              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                              __shared_count<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::FixBoundsPS*>
                                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                         (result.m_backend.data._M_elems + 2),pFVar24);
                              if (local_678.
                                  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi !=
                                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                          (local_678.
                                           super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_refcount._M_pi);
                              }
                              std::
                              vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
                              ::push_back(&local_858->data,(value_type *)&result);
                              (*(lp->
                                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).
                                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                .
                                super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._vptr_ClassArray[0x2a])
                                        (lp,lVar27,
                                         (lp->
                                         super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                         ).up.val.
                                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start + lVar27,0);
                              p_Var38 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                        result.m_backend.data._M_elems._8_8_;
                              if (result.m_backend.data._M_elems._8_8_ == 0) goto LAB_00312efd;
LAB_00312ef8:
                              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var38)
                              ;
                            }
LAB_00312efd:
                            pnVar41 = (lp->
                                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      ).low.val.
                                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start;
                            local_418 = *(undefined8 *)(pnVar41[lVar27].m_backend.data._M_elems + 8)
                            ;
                            local_438._0_8_ = *(undefined8 *)&pnVar41[lVar27].m_backend.data;
                            local_438.data = *(int **)(pnVar41[lVar27].m_backend.data._M_elems + 2);
                            puVar4 = pnVar41[lVar27].m_backend.data._M_elems + 4;
                            local_438.memFactor = *(Real *)puVar4;
                            uStack_420 = *(undefined8 *)(puVar4 + 2);
                            pnVar41 = (lp->
                                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      ).up.val.
                                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start;
                            pnVar28 = *(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                        **)(pnVar41[lVar27].m_backend.data._M_elems + 8);
                            local_468 = *(int **)&pnVar41[lVar27].m_backend.data;
                            auStack_460 = *(uint (*) [2])
                                           (pnVar41[lVar27].m_backend.data._M_elems + 2);
                            puVar4 = pnVar41[lVar27].m_backend.data._M_elems + 4;
                            local_458 = *(uint (*) [2])puVar4;
                            auStack_450 = *(uint (*) [2])(puVar4 + 2);
                            iVar31 = pnVar41[lVar27].m_backend.exp;
                            bVar6 = pnVar41[lVar27].m_backend.neg;
                            lVar32._0_4_ = pnVar41[lVar27].m_backend.fpclass;
                            lVar32._4_4_ = pnVar41[lVar27].m_backend.prec_elem;
                            local_448 = pnVar28;
                            feastol((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                     *)&local_110,this);
                            da_perm.thesize = local_438.thesize;
                            da_perm.themax = local_438.themax;
                            da_perm.data = local_438.data;
                            da_perm.memFactor = local_438.memFactor;
                            perm = local_468;
                            auStack_890[0] = auStack_460[0];
                            auStack_890[1] = auStack_460[1];
                            local_888[0] = local_458[0];
                            local_888[1] = local_458[1];
                            auStack_880[0] = auStack_450[0];
                            auStack_880[1] = auStack_450[1];
                            local_878 = local_448;
                            local_870 = iVar31;
                            local_86c = bVar6;
                            local_868 = lVar32;
                            relDiff<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
                                      (&result_2,(soplex *)&da_perm,
                                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                        *)&perm,pnVar28);
                            result.m_backend.data._M_elems._32_5_ =
                                 result_2.m_backend.data._M_elems._32_5_;
                            result.m_backend.data._M_elems[9]._1_3_ =
                                 result_2.m_backend.data._M_elems[9]._1_3_;
                            result.m_backend.data._M_elems[4] = result_2.m_backend.data._M_elems[4];
                            result.m_backend.data._M_elems[5] = result_2.m_backend.data._M_elems[5];
                            result.m_backend.data._M_elems._24_5_ =
                                 result_2.m_backend.data._M_elems._24_5_;
                            result.m_backend.data._M_elems[7]._1_3_ =
                                 result_2.m_backend.data._M_elems[7]._1_3_;
                            result.m_backend.data._M_elems[0] = result_2.m_backend.data._M_elems[0];
                            result.m_backend.data._M_elems[1] = result_2.m_backend.data._M_elems[1];
                            result.m_backend.data._M_elems[2] = result_2.m_backend.data._M_elems[2];
                            result.m_backend.data._M_elems[3] = result_2.m_backend.data._M_elems[3];
                            auVar16 = (undefined1  [16])result.m_backend.data._M_elems._0_16_;
                            result.m_backend.exp = result_2.m_backend.exp;
                            result.m_backend.neg = result_2.m_backend.neg;
                            result.m_backend.fpclass = result_2.m_backend.fpclass;
                            result.m_backend.prec_elem = result_2.m_backend.prec_elem;
                            if ((result_2.m_backend.neg == true) &&
                               (result.m_backend.data._M_elems[0] =
                                     result_2.m_backend.data._M_elems[0],
                               result.m_backend.data._M_elems[0] != 0 ||
                               result_2.m_backend.fpclass != cpp_dec_float_finite)) {
                              result.m_backend.neg = false;
                            }
                            result.m_backend.data._M_elems._0_16_ = auVar16;
                            if (((result_2.m_backend.fpclass != cpp_dec_float_NaN) &&
                                (local_110.fpclass != cpp_dec_float_NaN)) &&
                               (iVar31 = boost::multiprecision::backends::
                                         cpp_dec_float<50U,_int,_void>::compare
                                                   (&result.m_backend,&local_110), iVar31 < 1)) {
                              remCol.data[lVar27] = true;
                              fixAndRemCol.data[lVar27] = true;
                              piVar12 = (this->m_stat).data + 0xd;
                              *piVar12 = *piVar12 + 1;
                            }
                          }
                          else {
                            pnVar41 = (lp->
                                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      ).low.val.
                                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start;
                            pnVar28 = *(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                        **)(pnVar41[lVar27].m_backend.data._M_elems + 8);
                            local_378._0_8_ = *(undefined8 *)&pnVar41[lVar27].m_backend.data;
                            local_378.data = *(int **)(pnVar41[lVar27].m_backend.data._M_elems + 2);
                            puVar4 = pnVar41[lVar27].m_backend.data._M_elems + 4;
                            local_378.memFactor = *(Real *)puVar4;
                            uStack_360 = *(undefined8 *)(puVar4 + 2);
                            local_4b8 = 0xa00000000;
                            local_4e8 = (int *)0x0;
                            auStack_4e0[0] = 0;
                            auStack_4e0[1] = 0;
                            auStack_4e0[2] = 0;
                            auStack_4e0[3] = 0;
                            uStack_4d0 = 0;
                            uStack_4cb = 0;
                            local_4c8 = 0;
                            uStack_4c3 = 0;
                            local_4c0 = 0;
                            local_4bc = 0;
                            local_358 = pnVar28;
                            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                                      ((cpp_dec_float<50u,int,void> *)&local_4e8,0.0);
                            pTVar9 = (this->
                                     super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     )._tolerances.
                                     super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr;
                            p_Var38 = (this->
                                      super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      )._tolerances.
                                      super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount._M_pi;
                            if (p_Var38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                              if (__libc_single_threaded == '\0') {
                                LOCK();
                                p_Var38->_M_use_count = p_Var38->_M_use_count + 1;
                                UNLOCK();
                              }
                              else {
                                p_Var38->_M_use_count = p_Var38->_M_use_count + 1;
                              }
                            }
                            RVar45 = Tolerances::epsilon(pTVar9);
                            da_perm.thesize = local_378.thesize;
                            da_perm.themax = local_378.themax;
                            da_perm.data = local_378.data;
                            da_perm.memFactor = local_378.memFactor;
                            auStack_880[1]._1_3_ = uStack_4cb;
                            auStack_880._0_5_ = uStack_4d0;
                            perm = local_4e8;
                            auStack_890[0] = auStack_4e0[0];
                            auStack_890[1] = auStack_4e0[1];
                            local_888[0] = auStack_4e0[2];
                            local_888[1] = auStack_4e0[3];
                            local_878 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                         *)CONCAT35(uStack_4c3,local_4c8);
                            local_870 = local_4c0;
                            local_86c = (bool)local_4bc;
                            local_868 = local_4b8;
                            relDiff<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
                                      (&result_2,(soplex *)&da_perm,
                                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                        *)&perm,pnVar28);
                            bVar6 = false;
                            if ((!NAN(RVar45)) &&
                               (bVar6 = false, result_2.m_backend.fpclass != cpp_dec_float_NaN)) {
                              result.m_backend.fpclass = cpp_dec_float_finite;
                              result.m_backend.prec_elem = 10;
                              result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                              result.m_backend.data._M_elems[4] = 0;
                              result.m_backend.data._M_elems[5] = 0;
                              result.m_backend.data._M_elems._24_5_ = 0;
                              result.m_backend.data._M_elems[7]._1_3_ = 0;
                              result.m_backend.data._M_elems._32_5_ = 0;
                              result.m_backend.data._M_elems[9]._1_3_ = 0;
                              result.m_backend.exp = 0;
                              result.m_backend.neg = false;
                              boost::multiprecision::backends::cpp_dec_float<50u,int,void>::
                              operator=((cpp_dec_float<50u,int,void> *)&result,RVar45);
                              iVar20 = boost::multiprecision::backends::
                                       cpp_dec_float<50U,_int,_void>::compare
                                                 (&result_2.m_backend,&result.m_backend);
                              bVar6 = iVar20 < 1;
                            }
                            if (bVar6) {
                              pnVar41 = (lp->
                                        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        ).up.val.
                                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start;
                              pnVar28 = *(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                          **)(pnVar41[lVar27].m_backend.data._M_elems + 8);
                              local_3a8._0_8_ = *(undefined8 *)&pnVar41[lVar27].m_backend.data;
                              local_3a8.data =
                                   *(int **)(pnVar41[lVar27].m_backend.data._M_elems + 2);
                              puVar4 = pnVar41[lVar27].m_backend.data._M_elems + 4;
                              local_3a8.memFactor = *(Real *)puVar4;
                              uStack_390 = *(undefined8 *)(puVar4 + 2);
                              local_4f8 = 0xa00000000;
                              local_528 = (int *)0x0;
                              auStack_520[0] = 0;
                              auStack_520[1] = 0;
                              auStack_520[2] = 0;
                              auStack_520[3] = 0;
                              uStack_510 = 0;
                              uStack_50b = 0;
                              local_508 = 0;
                              uStack_503 = 0;
                              local_500 = 0;
                              local_4fc = 0;
                              local_388 = pnVar28;
                              boost::multiprecision::backends::cpp_dec_float<50u,int,void>::
                              operator=((cpp_dec_float<50u,int,void> *)&local_528,0.0);
                              pTVar9 = (this->
                                       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                       )._tolerances.
                                       super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr;
                              local_840 = (this->
                                          super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                          )._tolerances.
                                          super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount._M_pi;
                              if (local_840 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
                              {
                                if (__libc_single_threaded == '\0') {
                                  LOCK();
                                  local_840->_M_use_count = local_840->_M_use_count + 1;
                                  UNLOCK();
                                }
                                else {
                                  local_840->_M_use_count = local_840->_M_use_count + 1;
                                }
                              }
                              RVar45 = Tolerances::epsilon(pTVar9);
                              da_perm.thesize = local_3a8.thesize;
                              da_perm.themax = local_3a8.themax;
                              da_perm.data = local_3a8.data;
                              da_perm.memFactor = local_3a8.memFactor;
                              auStack_880[1]._1_3_ = uStack_50b;
                              auStack_880._0_5_ = uStack_510;
                              perm = local_528;
                              auStack_890[0] = auStack_520[0];
                              auStack_890[1] = auStack_520[1];
                              local_888[0] = auStack_520[2];
                              local_888[1] = auStack_520[3];
                              local_878 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                           *)CONCAT35(uStack_503,local_508);
                              local_870 = local_500;
                              local_86c = (bool)local_4fc;
                              local_868 = local_4f8;
                              relDiff<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
                                        (&result_2,(soplex *)&da_perm,
                                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                          *)&perm,pnVar28);
                              if ((NAN(RVar45)) || (result_2.m_backend.fpclass == cpp_dec_float_NaN)
                                 ) goto LAB_00311dea;
                              result.m_backend.fpclass = cpp_dec_float_finite;
                              result.m_backend.prec_elem = 10;
                              result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                              result.m_backend.data._M_elems[4] = 0;
                              result.m_backend.data._M_elems[5] = 0;
                              result.m_backend.data._M_elems._24_5_ = 0;
                              result.m_backend.data._M_elems[7]._1_3_ = 0;
                              result.m_backend.data._M_elems._32_5_ = 0;
                              result.m_backend.data._M_elems[9]._1_3_ = 0;
                              result.m_backend.exp = 0;
                              result.m_backend.neg = false;
                              boost::multiprecision::backends::cpp_dec_float<50u,int,void>::
                              operator=((cpp_dec_float<50u,int,void> *)&result,-RVar45);
                              iVar20 = boost::multiprecision::backends::
                                       cpp_dec_float<50U,_int,_void>::compare
                                                 (&result_2.m_backend,&result.m_backend);
                              if (iVar20 < 1) goto LAB_00311dea;
                              pnVar41 = (lp->
                                        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        ).low.val.
                                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start;
                              pnVar28 = *(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                          **)(pnVar41[lVar32].m_backend.data._M_elems + 8);
                              local_3d8._0_8_ = *(undefined8 *)&pnVar41[lVar32].m_backend.data;
                              local_3d8.data =
                                   *(int **)(pnVar41[lVar32].m_backend.data._M_elems + 2);
                              puVar4 = pnVar41[lVar32].m_backend.data._M_elems + 4;
                              local_3d8.memFactor = *(Real *)puVar4;
                              uStack_3c0 = *(undefined8 *)(puVar4 + 2);
                              local_538 = 0xa00000000;
                              local_568 = (int *)0x0;
                              auStack_560[0] = 0;
                              auStack_560[1] = 0;
                              auStack_560[2] = 0;
                              auStack_560[3] = 0;
                              uStack_550 = 0;
                              uStack_54b = 0;
                              local_548 = 0;
                              uStack_543 = 0;
                              local_540 = 0;
                              local_53c = 0;
                              local_3b8 = pnVar28;
                              boost::multiprecision::backends::cpp_dec_float<50u,int,void>::
                              operator=((cpp_dec_float<50u,int,void> *)&local_568,0.0);
                              pTVar9 = (this->
                                       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                       )._tolerances.
                                       super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr;
                              local_848 = (this->
                                          super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                          )._tolerances.
                                          super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount._M_pi;
                              if (local_848 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
                              {
                                if (__libc_single_threaded == '\0') {
                                  LOCK();
                                  local_848->_M_use_count = local_848->_M_use_count + 1;
                                  UNLOCK();
                                }
                                else {
                                  local_848->_M_use_count = local_848->_M_use_count + 1;
                                }
                              }
                              RVar45 = Tolerances::epsilon(pTVar9);
                              da_perm.thesize = local_3d8.thesize;
                              da_perm.themax = local_3d8.themax;
                              da_perm.data = local_3d8.data;
                              da_perm.memFactor = local_3d8.memFactor;
                              auStack_880[1]._1_3_ = uStack_54b;
                              auStack_880._0_5_ = uStack_550;
                              perm = local_568;
                              auStack_890[0] = auStack_560[0];
                              auStack_890[1] = auStack_560[1];
                              local_888[0] = auStack_560[2];
                              local_888[1] = auStack_560[3];
                              local_878 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                           *)CONCAT35(uStack_543,local_548);
                              local_870 = local_540;
                              local_86c = (bool)local_53c;
                              local_868 = local_538;
                              relDiff<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
                                        (&result_2,(soplex *)&da_perm,
                                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                          *)&perm,pnVar28);
                              if ((NAN(RVar45)) || (result_2.m_backend.fpclass == cpp_dec_float_NaN)
                                 ) {
LAB_0031285f:
                                bVar15 = false;
                                goto LAB_00311df0;
                              }
                              result.m_backend.fpclass = cpp_dec_float_finite;
                              result.m_backend.prec_elem = 10;
                              result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                              result.m_backend.data._M_elems[4] = 0;
                              result.m_backend.data._M_elems[5] = 0;
                              result.m_backend.data._M_elems._24_5_ = 0;
                              result.m_backend.data._M_elems[7]._1_3_ = 0;
                              result.m_backend.data._M_elems._32_5_ = 0;
                              result.m_backend.data._M_elems[9]._1_3_ = 0;
                              result.m_backend.exp = 0;
                              result.m_backend.neg = false;
                              boost::multiprecision::backends::cpp_dec_float<50u,int,void>::
                              operator=((cpp_dec_float<50u,int,void> *)&result,RVar45);
                              iVar20 = boost::multiprecision::backends::
                                       cpp_dec_float<50U,_int,_void>::compare
                                                 (&result_2.m_backend,&result.m_backend);
                              if (0 < iVar20) goto LAB_0031285f;
                              pnVar41 = (lp->
                                        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        ).up.val.
                                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start;
                              pnVar28 = *(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                          **)(pnVar41[lVar32].m_backend.data._M_elems + 8);
                              local_408._0_8_ = *(undefined8 *)&pnVar41[lVar32].m_backend.data;
                              local_408.data =
                                   *(int **)(pnVar41[lVar32].m_backend.data._M_elems + 2);
                              puVar4 = pnVar41[lVar32].m_backend.data._M_elems + 4;
                              local_408.memFactor = *(Real *)puVar4;
                              uStack_3f0 = *(undefined8 *)(puVar4 + 2);
                              local_578 = 0xa00000000;
                              local_5a8 = (int *)0x0;
                              auStack_5a0[0] = 0;
                              auStack_5a0[1] = 0;
                              auStack_5a0[2] = 0;
                              auStack_5a0[3] = 0;
                              uStack_590 = 0;
                              uStack_58b = 0;
                              local_588 = 0;
                              uStack_583 = 0;
                              local_580 = 0;
                              local_57c = 0;
                              local_3e8 = pnVar28;
                              boost::multiprecision::backends::cpp_dec_float<50u,int,void>::
                              operator=((cpp_dec_float<50u,int,void> *)&local_5a8,0.0);
                              pTVar9 = (this->
                                       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                       )._tolerances.
                                       super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr;
                              local_850 = (this->
                                          super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                          )._tolerances.
                                          super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount._M_pi;
                              if (local_850 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
                              {
                                if (__libc_single_threaded == '\0') {
                                  LOCK();
                                  local_850->_M_use_count = local_850->_M_use_count + 1;
                                  UNLOCK();
                                }
                                else {
                                  local_850->_M_use_count = local_850->_M_use_count + 1;
                                }
                              }
                              RVar45 = Tolerances::epsilon(pTVar9);
                              da_perm.thesize = local_408.thesize;
                              da_perm.themax = local_408.themax;
                              da_perm.data = local_408.data;
                              da_perm.memFactor = local_408.memFactor;
                              auStack_880[1]._1_3_ = uStack_58b;
                              auStack_880._0_5_ = uStack_590;
                              perm = local_5a8;
                              auStack_890[0] = auStack_5a0[0];
                              auStack_890[1] = auStack_5a0[1];
                              local_888[0] = auStack_5a0[2];
                              local_888[1] = auStack_5a0[3];
                              local_878 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                           *)CONCAT35(uStack_583,local_588);
                              local_870 = local_580;
                              local_86c = (bool)local_57c;
                              local_868 = local_578;
                              relDiff<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
                                        (&result_2,(soplex *)&da_perm,
                                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                          *)&perm,pnVar28);
                              bVar13 = false;
                              if ((!NAN(RVar45)) &&
                                 (result_2.m_backend.fpclass != cpp_dec_float_NaN)) {
                                result.m_backend.fpclass = cpp_dec_float_finite;
                                result.m_backend.prec_elem = 10;
                                result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                                result.m_backend.data._M_elems[4] = 0;
                                result.m_backend.data._M_elems[5] = 0;
                                result.m_backend.data._M_elems._24_5_ = 0;
                                result.m_backend.data._M_elems[7]._1_3_ = 0;
                                result.m_backend.data._M_elems._32_5_ = 0;
                                result.m_backend.data._M_elems[9]._1_3_ = 0;
                                result.m_backend.exp = 0;
                                result.m_backend.neg = false;
                                boost::multiprecision::backends::cpp_dec_float<50u,int,void>::
                                operator=((cpp_dec_float<50u,int,void> *)&result,-RVar45);
                                iVar20 = boost::multiprecision::backends::
                                         cpp_dec_float<50U,_int,_void>::compare
                                                   (&result_2.m_backend,&result.m_backend);
                                bVar13 = 0 < iVar20;
                              }
                              bVar15 = false;
                              bVar14 = false;
                            }
                            else {
LAB_00311dea:
                              bVar15 = true;
LAB_00311df0:
                              bVar13 = false;
                              bVar14 = true;
                            }
                            if ((!bVar14) &&
                               (local_850 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                        (local_850);
                            }
                            if (!bVar15 &&
                                local_848 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                        (local_848);
                            }
                            if ((bool)(bVar6 & local_840 !=
                                               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0))
                            {
                              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                        (local_840);
                            }
                            if (p_Var38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var38)
                              ;
                            }
                            if (bVar13) {
                              pDVar23 = (DuplicateColsPS *)operator_new(0x168);
                              local_188.m_backend.data._M_elems[9]._1_3_ =
                                   factor.m_backend.data._M_elems[9]._1_3_;
                              local_188.m_backend.data._M_elems._32_5_ =
                                   factor.m_backend.data._M_elems._32_5_;
                              local_188.m_backend.data._M_elems[7]._1_3_ =
                                   factor.m_backend.data._M_elems[7]._1_3_;
                              local_188.m_backend.data._M_elems._24_5_ =
                                   factor.m_backend.data._M_elems._24_5_;
                              local_188.m_backend.data._M_elems[4] =
                                   factor.m_backend.data._M_elems[4];
                              local_188.m_backend.data._M_elems[5] =
                                   factor.m_backend.data._M_elems[5];
                              local_188.m_backend.data._M_elems[0] =
                                   factor.m_backend.data._M_elems[0];
                              local_188.m_backend.data._M_elems[1] =
                                   factor.m_backend.data._M_elems[1];
                              local_188.m_backend.data._M_elems[2] =
                                   factor.m_backend.data._M_elems[2];
                              local_188.m_backend.data._M_elems[3] =
                                   factor.m_backend.data._M_elems[3];
                              local_188.m_backend.exp = factor.m_backend.exp;
                              local_188.m_backend.neg = factor.m_backend.neg;
                              local_188.m_backend.fpclass = factor.m_backend.fpclass;
                              local_188.m_backend.prec_elem = factor.m_backend.prec_elem;
                              DataArray<int>::DataArray(&local_610,&m_perm_empty);
                              local_668.
                              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr = (this->
                                       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                       )._tolerances.
                                       super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr;
                              local_668.
                              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi =
                                   (this->
                                   super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   )._tolerances.
                                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount._M_pi;
                              if (local_668.
                                  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi !=
                                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                if (__libc_single_threaded == '\0') {
                                  LOCK();
                                  (local_668.
                                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount._M_pi)->_M_use_count =
                                       (local_668.
                                        super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount._M_pi)->_M_use_count + 1;
                                  UNLOCK();
                                }
                                else {
                                  (local_668.
                                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount._M_pi)->_M_use_count =
                                       (local_668.
                                        super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount._M_pi)->_M_use_count + 1;
                                }
                              }
                              DuplicateColsPS::DuplicateColsPS
                                        (pDVar23,lp,iVar31,iVar36,&local_188,&local_610,&local_668,
                                         false,false);
                              da_perm._0_8_ = pDVar23;
                              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                              __shared_count<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::DuplicateColsPS*>
                                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&da_perm.data
                                         ,pDVar23);
                              if (local_668.
                                  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi !=
                                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                          (local_668.
                                           super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_refcount._M_pi);
                              }
                              if (local_610.data != (int *)0x0) {
                                free(local_610.data);
                                local_610.data = (int *)0x0;
                              }
                              std::
                              vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
                              ::push_back(&local_858->data,(value_type *)&da_perm);
                              if (factor.m_backend.fpclass == cpp_dec_float_NaN) {
LAB_00312222:
                                if (factor.m_backend.fpclass != cpp_dec_float_NaN) {
                                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                                  cpp_dec_float<long_long>(&result.m_backend,0,(type *)0x0);
                                  iVar31 = boost::multiprecision::backends::
                                           cpp_dec_float<50U,_int,_void>::compare
                                                     (&factor.m_backend,&result.m_backend);
                                  if (iVar31 < 0) {
                                    pcVar37 = &(lp->
                                               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                               ).low.val.
                                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start[lVar32].
                                               m_backend;
                                    ::soplex::infinity::__tls_init();
                                    result.m_backend.fpclass = cpp_dec_float_finite;
                                    result.m_backend.prec_elem = 10;
                                    result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                                    result.m_backend.data._M_elems[4] = 0;
                                    result.m_backend.data._M_elems[5] = 0;
                                    result.m_backend.data._M_elems._24_5_ = 0;
                                    result.m_backend.data._M_elems[7]._1_3_ = 0;
                                    result.m_backend.data._M_elems._32_5_ = 0;
                                    result.m_backend.data._M_elems[9]._1_3_ = 0;
                                    result.m_backend.exp = 0;
                                    result.m_backend.neg = false;
                                    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::
                                    operator=((cpp_dec_float<50u,int,void> *)&result,local_828);
                                    if (((pcVar37->fpclass == cpp_dec_float_NaN) ||
                                        (result.m_backend.fpclass == cpp_dec_float_NaN)) ||
                                       (iVar31 = boost::multiprecision::backends::
                                                 cpp_dec_float<50U,_int,_void>::compare
                                                           (pcVar37,&result.m_backend), 0 < iVar31))
                                    {
                                      pcVar37 = &(lp->
                                                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                 ).up.val.
                                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start[lVar27].
                                                 m_backend;
                                      ::soplex::infinity::__tls_init();
                                      result_2.m_backend.fpclass = cpp_dec_float_finite;
                                      result_2.m_backend.prec_elem = 10;
                                      result_2.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                                      result_2.m_backend.data._M_elems[4] = 0;
                                      result_2.m_backend.data._M_elems[5] = 0;
                                      result_2.m_backend.data._M_elems._24_5_ = 0;
                                      result_2.m_backend.data._M_elems[7]._1_3_ = 0;
                                      result_2.m_backend.data._M_elems._32_5_ = 0;
                                      result_2.m_backend.data._M_elems[9]._1_3_ = 0;
                                      result_2.m_backend.exp = 0;
                                      result_2.m_backend.neg = false;
                                      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::
                                      operator=((cpp_dec_float<50u,int,void> *)&result_2,local_838);
                                      if (((pcVar37->fpclass != cpp_dec_float_NaN) &&
                                          (result_2.m_backend.fpclass != cpp_dec_float_NaN)) &&
                                         (iVar31 = boost::multiprecision::backends::
                                                   cpp_dec_float<50U,_int,_void>::compare
                                                             (pcVar37,&result_2.m_backend),
                                         -1 < iVar31)) goto LAB_00312347;
                                      pnVar41 = (lp->
                                                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                ).low.val.
                                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start + lVar32;
                                      pcVar25 = &(lp->
                                                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                 ).up.val.
                                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start[lVar27].
                                                 m_backend;
                                      result_2.m_backend.fpclass = cpp_dec_float_finite;
                                      result_2.m_backend.prec_elem = 10;
                                      result_2.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                                      result_2.m_backend.data._M_elems[4] = 0;
                                      result_2.m_backend.data._M_elems[5] = 0;
                                      result_2.m_backend.data._M_elems._24_5_ = 0;
                                      result_2.m_backend.data._M_elems[7]._1_3_ = 0;
                                      result_2.m_backend.data._M_elems._32_5_ = 0;
                                      result_2.m_backend.data._M_elems[9]._1_3_ = 0;
                                      result_2.m_backend.exp = 0;
                                      result_2.m_backend.neg = false;
                                      pcVar37 = &factor.m_backend;
                                      if (&result_2.m_backend != pcVar25) {
                                        result_2.m_backend.data._M_elems._32_5_ =
                                             factor.m_backend.data._M_elems._32_5_;
                                        result_2.m_backend.data._M_elems[9]._1_3_ =
                                             factor.m_backend.data._M_elems[9]._1_3_;
                                        result_2.m_backend.data._M_elems[4] =
                                             factor.m_backend.data._M_elems[4];
                                        result_2.m_backend.data._M_elems[5] =
                                             factor.m_backend.data._M_elems[5];
                                        result_2.m_backend.data._M_elems._24_5_ =
                                             factor.m_backend.data._M_elems._24_5_;
                                        result_2.m_backend.data._M_elems[7]._1_3_ =
                                             factor.m_backend.data._M_elems[7]._1_3_;
                                        result_2.m_backend.data._M_elems[2] =
                                             factor.m_backend.data._M_elems[2];
                                        result_2.m_backend.data._M_elems[3] =
                                             factor.m_backend.data._M_elems[3];
                                        result_2.m_backend.data._M_elems[0] =
                                             factor.m_backend.data._M_elems[0];
                                        result_2.m_backend.data._M_elems[1] =
                                             factor.m_backend.data._M_elems[1];
                                        result_2.m_backend.exp = factor.m_backend.exp;
                                        result_2.m_backend.neg = factor.m_backend.neg;
                                        result_2.m_backend.fpclass = factor.m_backend.fpclass;
                                        result_2.m_backend.prec_elem = factor.m_backend.prec_elem;
                                        pcVar37 = pcVar25;
                                      }
                                      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>
                                      ::operator*=(&result_2.m_backend,pcVar37);
                                      result.m_backend.fpclass = cpp_dec_float_finite;
                                      result.m_backend.prec_elem = 10;
                                      result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                                      result.m_backend.data._M_elems[4] = 0;
                                      result.m_backend.data._M_elems[5] = 0;
                                      result.m_backend.data._M_elems._24_5_ = 0;
                                      result.m_backend.data._M_elems[7]._1_3_ = 0;
                                      result.m_backend.data._M_elems._32_5_ = 0;
                                      result.m_backend.data._M_elems[9]._1_3_ = 0;
                                      result.m_backend.exp = 0;
                                      result.m_backend.neg = false;
                                      if (&result != pnVar41) {
                                        uVar8 = *(undefined8 *)
                                                 ((pnVar41->m_backend).data._M_elems + 8);
                                        result.m_backend.data._M_elems._32_5_ = SUB85(uVar8,0);
                                        result.m_backend.data._M_elems[9]._1_3_ =
                                             (undefined3)((ulong)uVar8 >> 0x28);
                                        result.m_backend.data._M_elems._0_16_ =
                                             *(undefined1 (*) [16])&(pnVar41->m_backend).data;
                                        result.m_backend.data._M_elems._16_8_ =
                                             *(undefined8 *)((pnVar41->m_backend).data._M_elems + 4)
                                        ;
                                        uVar8 = *(undefined8 *)
                                                 ((pnVar41->m_backend).data._M_elems + 6);
                                        result.m_backend.data._M_elems._24_5_ = SUB85(uVar8,0);
                                        result.m_backend.data._M_elems[7]._1_3_ =
                                             (undefined3)((ulong)uVar8 >> 0x28);
                                        result.m_backend.exp = (pnVar41->m_backend).exp;
                                        result.m_backend.neg = (pnVar41->m_backend).neg;
                                        result.m_backend.fpclass = (pnVar41->m_backend).fpclass;
                                        result.m_backend.prec_elem = (pnVar41->m_backend).prec_elem;
                                      }
                                      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>
                                      ::operator+=(&result.m_backend,&result_2.m_backend);
                                      (*(lp->
                                        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        ).
                                        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        .
                                        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                        ._vptr_ClassArray[0x2a])(lp,lVar32,&result,0);
                                    }
                                    else {
LAB_00312347:
                                      ::soplex::infinity::__tls_init();
                                      result.m_backend.fpclass = cpp_dec_float_finite;
                                      result.m_backend.prec_elem = 10;
                                      result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                                      result.m_backend.data._M_elems[4] = 0;
                                      result.m_backend.data._M_elems[5] = 0;
                                      result.m_backend.data._M_elems._24_5_ = 0;
                                      result.m_backend.data._M_elems[7]._1_3_ = 0;
                                      result.m_backend.data._M_elems._32_5_ = 0;
                                      result.m_backend.data._M_elems[9]._1_3_ = 0;
                                      result.m_backend.exp = 0;
                                      result.m_backend.neg = false;
                                      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::
                                      operator=((cpp_dec_float<50u,int,void> *)&result,local_828);
                                      (*(lp->
                                        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        ).
                                        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        .
                                        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                        ._vptr_ClassArray[0x2a])(lp,lVar32,&result,0);
                                    }
                                    pcVar37 = &(lp->
                                               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                               ).up.val.
                                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start[lVar32].
                                               m_backend;
                                    ::soplex::infinity::__tls_init();
                                    result.m_backend.fpclass = cpp_dec_float_finite;
                                    result.m_backend.prec_elem = 10;
                                    result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                                    result.m_backend.data._M_elems[4] = 0;
                                    result.m_backend.data._M_elems[5] = 0;
                                    result.m_backend.data._M_elems._24_5_ = 0;
                                    result.m_backend.data._M_elems[7]._1_3_ = 0;
                                    result.m_backend.data._M_elems._32_5_ = 0;
                                    result.m_backend.data._M_elems[9]._1_3_ = 0;
                                    result.m_backend.exp = 0;
                                    result.m_backend.neg = false;
                                    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::
                                    operator=((cpp_dec_float<50u,int,void> *)&result,local_838);
                                    if (((pcVar37->fpclass == cpp_dec_float_NaN) ||
                                        (result.m_backend.fpclass == cpp_dec_float_NaN)) ||
                                       (iVar31 = boost::multiprecision::backends::
                                                 cpp_dec_float<50U,_int,_void>::compare
                                                           (pcVar37,&result.m_backend), iVar31 < 0))
                                    {
                                      pcVar37 = &(lp->
                                                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                 ).low.val.
                                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start[lVar27].
                                                 m_backend;
                                      ::soplex::infinity::__tls_init();
                                      result_2.m_backend.fpclass = cpp_dec_float_finite;
                                      result_2.m_backend.prec_elem = 10;
                                      result_2.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                                      result_2.m_backend.data._M_elems[4] = 0;
                                      result_2.m_backend.data._M_elems[5] = 0;
                                      result_2.m_backend.data._M_elems._24_5_ = 0;
                                      result_2.m_backend.data._M_elems[7]._1_3_ = 0;
                                      result_2.m_backend.data._M_elems._32_5_ = 0;
                                      result_2.m_backend.data._M_elems[9]._1_3_ = 0;
                                      result_2.m_backend.exp = 0;
                                      result_2.m_backend.neg = false;
                                      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::
                                      operator=((cpp_dec_float<50u,int,void> *)&result_2,local_828);
                                      if (((pcVar37->fpclass == cpp_dec_float_NaN) ||
                                          (result_2.m_backend.fpclass == cpp_dec_float_NaN)) ||
                                         (iVar31 = boost::multiprecision::backends::
                                                   cpp_dec_float<50U,_int,_void>::compare
                                                             (pcVar37,&result_2.m_backend),
                                         0 < iVar31)) {
                                        pnVar41 = (lp->
                                                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                  ).up.val.
                                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + lVar32
                                        ;
                                        pcVar25 = &(lp->
                                                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                  ).low.val.
                                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[lVar27].
                                                  m_backend;
                                        result_2.m_backend.fpclass = cpp_dec_float_finite;
                                        result_2.m_backend.prec_elem = 10;
                                        result_2.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                                        result_2.m_backend.data._M_elems[4] = 0;
                                        result_2.m_backend.data._M_elems[5] = 0;
                                        result_2.m_backend.data._M_elems._24_5_ = 0;
                                        result_2.m_backend.data._M_elems[7]._1_3_ = 0;
                                        result_2.m_backend.data._M_elems._32_5_ = 0;
                                        result_2.m_backend.data._M_elems[9]._1_3_ = 0;
                                        result_2.m_backend.exp = 0;
                                        result_2.m_backend.neg = false;
                                        pcVar37 = &factor.m_backend;
                                        if (&result_2.m_backend != pcVar25) {
                                          result_2.m_backend.data._M_elems._32_5_ =
                                               factor.m_backend.data._M_elems._32_5_;
                                          result_2.m_backend.data._M_elems[9]._1_3_ =
                                               factor.m_backend.data._M_elems[9]._1_3_;
                                          result_2.m_backend.data._M_elems[4] =
                                               factor.m_backend.data._M_elems[4];
                                          result_2.m_backend.data._M_elems[5] =
                                               factor.m_backend.data._M_elems[5];
                                          result_2.m_backend.data._M_elems._24_5_ =
                                               factor.m_backend.data._M_elems._24_5_;
                                          result_2.m_backend.data._M_elems[7]._1_3_ =
                                               factor.m_backend.data._M_elems[7]._1_3_;
                                          result_2.m_backend.data._M_elems[2] =
                                               factor.m_backend.data._M_elems[2];
                                          result_2.m_backend.data._M_elems[3] =
                                               factor.m_backend.data._M_elems[3];
                                          result_2.m_backend.data._M_elems[0] =
                                               factor.m_backend.data._M_elems[0];
                                          result_2.m_backend.data._M_elems[1] =
                                               factor.m_backend.data._M_elems[1];
                                          result_2.m_backend.exp = factor.m_backend.exp;
                                          result_2.m_backend.neg = factor.m_backend.neg;
                                          result_2.m_backend.fpclass = factor.m_backend.fpclass;
                                          result_2.m_backend.prec_elem = factor.m_backend.prec_elem;
                                          pcVar37 = pcVar25;
                                        }
                                        boost::multiprecision::backends::
                                        cpp_dec_float<50U,_int,_void>::operator*=
                                                  (&result_2.m_backend,pcVar37);
                                        result.m_backend.fpclass = cpp_dec_float_finite;
                                        result.m_backend.prec_elem = 10;
                                        result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                                        result.m_backend.data._M_elems[4] = 0;
                                        result.m_backend.data._M_elems[5] = 0;
                                        result.m_backend.data._M_elems._24_5_ = 0;
                                        result.m_backend.data._M_elems[7]._1_3_ = 0;
                                        result.m_backend.data._M_elems._32_5_ = 0;
                                        result.m_backend.data._M_elems[9]._1_3_ = 0;
                                        result.m_backend.exp = 0;
                                        result.m_backend.neg = false;
                                        if (&result != pnVar41) {
                                          uVar8 = *(undefined8 *)
                                                   ((pnVar41->m_backend).data._M_elems + 8);
                                          result.m_backend.data._M_elems._32_5_ = SUB85(uVar8,0);
                                          result.m_backend.data._M_elems[9]._1_3_ =
                                               (undefined3)((ulong)uVar8 >> 0x28);
                                          result.m_backend.data._M_elems._0_16_ =
                                               *(undefined1 (*) [16])&(pnVar41->m_backend).data;
                                          result.m_backend.data._M_elems._16_8_ =
                                               *(undefined8 *)
                                                ((pnVar41->m_backend).data._M_elems + 4);
                                          uVar8 = *(undefined8 *)
                                                   ((pnVar41->m_backend).data._M_elems + 6);
                                          result.m_backend.data._M_elems._24_5_ = SUB85(uVar8,0);
                                          result.m_backend.data._M_elems[7]._1_3_ =
                                               (undefined3)((ulong)uVar8 >> 0x28);
                                          result.m_backend.exp = (pnVar41->m_backend).exp;
                                          result.m_backend.neg = (pnVar41->m_backend).neg;
                                          result.m_backend.fpclass = (pnVar41->m_backend).fpclass;
                                          result.m_backend.prec_elem =
                                               (pnVar41->m_backend).prec_elem;
                                        }
                                        boost::multiprecision::backends::
                                        cpp_dec_float<50U,_int,_void>::operator+=
                                                  (&result.m_backend,&result_2.m_backend);
                                        (*(lp->
                                          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                          ).
                                          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                          .
                                          super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                          ._vptr_ClassArray[0x2d])(lp,lVar32,&result,0);
                                        goto LAB_00312d91;
                                      }
                                    }
                                    ::soplex::infinity::__tls_init();
                                    result.m_backend.fpclass = cpp_dec_float_finite;
                                    result.m_backend.prec_elem = 10;
                                    result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                                    result.m_backend.data._M_elems[4] = 0;
                                    result.m_backend.data._M_elems[5] = 0;
                                    result.m_backend.data._M_elems._24_5_ = 0;
                                    result.m_backend.data._M_elems[7]._1_3_ = 0;
                                    result.m_backend.data._M_elems._32_5_ = 0;
                                    result.m_backend.data._M_elems[9]._1_3_ = 0;
                                    result.m_backend.exp = 0;
                                    result.m_backend.neg = false;
                                    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::
                                    operator=((cpp_dec_float<50u,int,void> *)&result,local_838);
                                    (*(lp->
                                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      ).
                                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      .
                                      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                      ._vptr_ClassArray[0x2d])(lp,lVar32,&result,0);
                                  }
                                }
                              }
                              else {
                                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                                cpp_dec_float<long_long>(&result.m_backend,0,(type *)0x0);
                                iVar31 = boost::multiprecision::backends::
                                         cpp_dec_float<50U,_int,_void>::compare
                                                   (&factor.m_backend,&result.m_backend);
                                if (iVar31 < 1) goto LAB_00312222;
                                pcVar37 = &(lp->
                                           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                           ).low.val.
                                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start[lVar32].
                                           m_backend;
                                ::soplex::infinity::__tls_init();
                                result.m_backend.fpclass = cpp_dec_float_finite;
                                result.m_backend.prec_elem = 10;
                                result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                                result.m_backend.data._M_elems[4] = 0;
                                result.m_backend.data._M_elems[5] = 0;
                                result.m_backend.data._M_elems._24_5_ = 0;
                                result.m_backend.data._M_elems[7]._1_3_ = 0;
                                result.m_backend.data._M_elems._32_5_ = 0;
                                result.m_backend.data._M_elems[9]._1_3_ = 0;
                                result.m_backend.exp = 0;
                                result.m_backend.neg = false;
                                boost::multiprecision::backends::cpp_dec_float<50u,int,void>::
                                operator=((cpp_dec_float<50u,int,void> *)&result,local_828);
                                if (((pcVar37->fpclass == cpp_dec_float_NaN) ||
                                    (result.m_backend.fpclass == cpp_dec_float_NaN)) ||
                                   (iVar31 = boost::multiprecision::backends::
                                             cpp_dec_float<50U,_int,_void>::compare
                                                       (pcVar37,&result.m_backend), 0 < iVar31)) {
                                  pcVar37 = &(lp->
                                             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                             ).low.val.
                                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start[lVar27].
                                             m_backend;
                                  ::soplex::infinity::__tls_init();
                                  result_2.m_backend.fpclass = cpp_dec_float_finite;
                                  result_2.m_backend.prec_elem = 10;
                                  result_2.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                                  result_2.m_backend.data._M_elems[4] = 0;
                                  result_2.m_backend.data._M_elems[5] = 0;
                                  result_2.m_backend.data._M_elems._24_5_ = 0;
                                  result_2.m_backend.data._M_elems[7]._1_3_ = 0;
                                  result_2.m_backend.data._M_elems._32_5_ = 0;
                                  result_2.m_backend.data._M_elems[9]._1_3_ = 0;
                                  result_2.m_backend.exp = 0;
                                  result_2.m_backend.neg = false;
                                  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::
                                  operator=((cpp_dec_float<50u,int,void> *)&result_2,local_828);
                                  if (((pcVar37->fpclass != cpp_dec_float_NaN) &&
                                      (result_2.m_backend.fpclass != cpp_dec_float_NaN)) &&
                                     (iVar31 = boost::multiprecision::backends::
                                               cpp_dec_float<50U,_int,_void>::compare
                                                         (pcVar37,&result_2.m_backend), iVar31 < 1))
                                  goto LAB_003123ad;
                                  pnVar41 = (lp->
                                            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                            ).low.val.
                                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start;
                                  pcVar25 = &pnVar41[lVar27].m_backend;
                                  result_2.m_backend.fpclass = cpp_dec_float_finite;
                                  result_2.m_backend.prec_elem = 10;
                                  result_2.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                                  result_2.m_backend.data._M_elems[4] = 0;
                                  result_2.m_backend.data._M_elems[5] = 0;
                                  result_2.m_backend.data._M_elems._24_5_ = 0;
                                  result_2.m_backend.data._M_elems[7]._1_3_ = 0;
                                  result_2.m_backend.data._M_elems._32_5_ = 0;
                                  result_2.m_backend.data._M_elems[9]._1_3_ = 0;
                                  result_2.m_backend.exp = 0;
                                  result_2.m_backend.neg = false;
                                  pcVar37 = &factor.m_backend;
                                  if (&result_2.m_backend != pcVar25) {
                                    result_2.m_backend.data._M_elems._32_5_ =
                                         factor.m_backend.data._M_elems._32_5_;
                                    result_2.m_backend.data._M_elems[9]._1_3_ =
                                         factor.m_backend.data._M_elems[9]._1_3_;
                                    result_2.m_backend.data._M_elems[4] =
                                         factor.m_backend.data._M_elems[4];
                                    result_2.m_backend.data._M_elems[5] =
                                         factor.m_backend.data._M_elems[5];
                                    result_2.m_backend.data._M_elems._24_5_ =
                                         factor.m_backend.data._M_elems._24_5_;
                                    result_2.m_backend.data._M_elems[7]._1_3_ =
                                         factor.m_backend.data._M_elems[7]._1_3_;
                                    result_2.m_backend.data._M_elems[2] =
                                         factor.m_backend.data._M_elems[2];
                                    result_2.m_backend.data._M_elems[3] =
                                         factor.m_backend.data._M_elems[3];
                                    result_2.m_backend.data._M_elems[0] =
                                         factor.m_backend.data._M_elems[0];
                                    result_2.m_backend.data._M_elems[1] =
                                         factor.m_backend.data._M_elems[1];
                                    result_2.m_backend.exp = factor.m_backend.exp;
                                    result_2.m_backend.neg = factor.m_backend.neg;
                                    result_2.m_backend.fpclass = factor.m_backend.fpclass;
                                    result_2.m_backend.prec_elem = factor.m_backend.prec_elem;
                                    pcVar37 = pcVar25;
                                  }
                                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                                  operator*=(&result_2.m_backend,pcVar37);
                                  pnVar41 = pnVar41 + lVar32;
                                  result.m_backend.fpclass = cpp_dec_float_finite;
                                  result.m_backend.prec_elem = 10;
                                  result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                                  result.m_backend.data._M_elems[4] = 0;
                                  result.m_backend.data._M_elems[5] = 0;
                                  result.m_backend.data._M_elems._24_5_ = 0;
                                  result.m_backend.data._M_elems[7]._1_3_ = 0;
                                  result.m_backend.data._M_elems._32_5_ = 0;
                                  result.m_backend.data._M_elems[9]._1_3_ = 0;
                                  result.m_backend.exp = 0;
                                  result.m_backend.neg = false;
                                  if (&result != pnVar41) {
                                    uVar8 = *(undefined8 *)((pnVar41->m_backend).data._M_elems + 8);
                                    result.m_backend.data._M_elems._32_5_ = SUB85(uVar8,0);
                                    result.m_backend.data._M_elems[9]._1_3_ =
                                         (undefined3)((ulong)uVar8 >> 0x28);
                                    result.m_backend.data._M_elems._0_16_ =
                                         *(undefined1 (*) [16])&(pnVar41->m_backend).data;
                                    result.m_backend.data._M_elems._16_8_ =
                                         *(undefined8 *)((pnVar41->m_backend).data._M_elems + 4);
                                    uVar8 = *(undefined8 *)((pnVar41->m_backend).data._M_elems + 6);
                                    result.m_backend.data._M_elems._24_5_ = SUB85(uVar8,0);
                                    result.m_backend.data._M_elems[7]._1_3_ =
                                         (undefined3)((ulong)uVar8 >> 0x28);
                                    result.m_backend.exp = (pnVar41->m_backend).exp;
                                    result.m_backend.neg = (pnVar41->m_backend).neg;
                                    result.m_backend.fpclass = (pnVar41->m_backend).fpclass;
                                    result.m_backend.prec_elem = (pnVar41->m_backend).prec_elem;
                                  }
                                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                                  operator+=(&result.m_backend,&result_2.m_backend);
                                  (*(lp->
                                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    ).
                                    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    .
                                    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                    ._vptr_ClassArray[0x2a])(lp,lVar32,&result,0);
                                }
                                else {
LAB_003123ad:
                                  ::soplex::infinity::__tls_init();
                                  result.m_backend.fpclass = cpp_dec_float_finite;
                                  result.m_backend.prec_elem = 10;
                                  result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                                  result.m_backend.data._M_elems[4] = 0;
                                  result.m_backend.data._M_elems[5] = 0;
                                  result.m_backend.data._M_elems._24_5_ = 0;
                                  result.m_backend.data._M_elems[7]._1_3_ = 0;
                                  result.m_backend.data._M_elems._32_5_ = 0;
                                  result.m_backend.data._M_elems[9]._1_3_ = 0;
                                  result.m_backend.exp = 0;
                                  result.m_backend.neg = false;
                                  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::
                                  operator=((cpp_dec_float<50u,int,void> *)&result,local_828);
                                  (*(lp->
                                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    ).
                                    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    .
                                    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                    ._vptr_ClassArray[0x2a])(lp,lVar32,&result,0);
                                }
                                pcVar37 = &(lp->
                                           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                           ).up.val.
                                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start[lVar32].
                                           m_backend;
                                ::soplex::infinity::__tls_init();
                                result.m_backend.fpclass = cpp_dec_float_finite;
                                result.m_backend.prec_elem = 10;
                                result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                                result.m_backend.data._M_elems[4] = 0;
                                result.m_backend.data._M_elems[5] = 0;
                                result.m_backend.data._M_elems._24_5_ = 0;
                                result.m_backend.data._M_elems[7]._1_3_ = 0;
                                result.m_backend.data._M_elems._32_5_ = 0;
                                result.m_backend.data._M_elems[9]._1_3_ = 0;
                                result.m_backend.exp = 0;
                                result.m_backend.neg = false;
                                boost::multiprecision::backends::cpp_dec_float<50u,int,void>::
                                operator=((cpp_dec_float<50u,int,void> *)&result,local_838);
                                if (((pcVar37->fpclass == cpp_dec_float_NaN) ||
                                    (result.m_backend.fpclass == cpp_dec_float_NaN)) ||
                                   (iVar31 = boost::multiprecision::backends::
                                             cpp_dec_float<50U,_int,_void>::compare
                                                       (pcVar37,&result.m_backend), iVar31 < 0)) {
                                  pcVar37 = &(lp->
                                             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                             ).up.val.
                                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start[lVar27].
                                             m_backend;
                                  ::soplex::infinity::__tls_init();
                                  result_2.m_backend.fpclass = cpp_dec_float_finite;
                                  result_2.m_backend.prec_elem = 10;
                                  result_2.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                                  result_2.m_backend.data._M_elems[4] = 0;
                                  result_2.m_backend.data._M_elems[5] = 0;
                                  result_2.m_backend.data._M_elems._24_5_ = 0;
                                  result_2.m_backend.data._M_elems[7]._1_3_ = 0;
                                  result_2.m_backend.data._M_elems._32_5_ = 0;
                                  result_2.m_backend.data._M_elems[9]._1_3_ = 0;
                                  result_2.m_backend.exp = 0;
                                  result_2.m_backend.neg = false;
                                  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::
                                  operator=((cpp_dec_float<50u,int,void> *)&result_2,local_838);
                                  if (((pcVar37->fpclass != cpp_dec_float_NaN) &&
                                      (result_2.m_backend.fpclass != cpp_dec_float_NaN)) &&
                                     (iVar31 = boost::multiprecision::backends::
                                               cpp_dec_float<50U,_int,_void>::compare
                                                         (pcVar37,&result_2.m_backend), -1 < iVar31)
                                     ) goto LAB_003124ee;
                                  pnVar41 = (lp->
                                            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                            ).up.val.
                                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start;
                                  pcVar25 = &pnVar41[lVar27].m_backend;
                                  result_2.m_backend.fpclass = cpp_dec_float_finite;
                                  result_2.m_backend.prec_elem = 10;
                                  result_2.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                                  result_2.m_backend.data._M_elems[4] = 0;
                                  result_2.m_backend.data._M_elems[5] = 0;
                                  result_2.m_backend.data._M_elems._24_5_ = 0;
                                  result_2.m_backend.data._M_elems[7]._1_3_ = 0;
                                  result_2.m_backend.data._M_elems._32_5_ = 0;
                                  result_2.m_backend.data._M_elems[9]._1_3_ = 0;
                                  result_2.m_backend.exp = 0;
                                  result_2.m_backend.neg = false;
                                  pcVar37 = &factor.m_backend;
                                  if (&result_2.m_backend != pcVar25) {
                                    result_2.m_backend.data._M_elems._32_5_ =
                                         factor.m_backend.data._M_elems._32_5_;
                                    result_2.m_backend.data._M_elems[9]._1_3_ =
                                         factor.m_backend.data._M_elems[9]._1_3_;
                                    result_2.m_backend.data._M_elems[4] =
                                         factor.m_backend.data._M_elems[4];
                                    result_2.m_backend.data._M_elems[5] =
                                         factor.m_backend.data._M_elems[5];
                                    result_2.m_backend.data._M_elems._24_5_ =
                                         factor.m_backend.data._M_elems._24_5_;
                                    result_2.m_backend.data._M_elems[7]._1_3_ =
                                         factor.m_backend.data._M_elems[7]._1_3_;
                                    result_2.m_backend.data._M_elems[2] =
                                         factor.m_backend.data._M_elems[2];
                                    result_2.m_backend.data._M_elems[3] =
                                         factor.m_backend.data._M_elems[3];
                                    result_2.m_backend.data._M_elems[0] =
                                         factor.m_backend.data._M_elems[0];
                                    result_2.m_backend.data._M_elems[1] =
                                         factor.m_backend.data._M_elems[1];
                                    result_2.m_backend.exp = factor.m_backend.exp;
                                    result_2.m_backend.neg = factor.m_backend.neg;
                                    result_2.m_backend.fpclass = factor.m_backend.fpclass;
                                    result_2.m_backend.prec_elem = factor.m_backend.prec_elem;
                                    pcVar37 = pcVar25;
                                  }
                                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                                  operator*=(&result_2.m_backend,pcVar37);
                                  pnVar41 = pnVar41 + lVar32;
                                  result.m_backend.fpclass = cpp_dec_float_finite;
                                  result.m_backend.prec_elem = 10;
                                  result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                                  result.m_backend.data._M_elems[4] = 0;
                                  result.m_backend.data._M_elems[5] = 0;
                                  result.m_backend.data._M_elems._24_5_ = 0;
                                  result.m_backend.data._M_elems[7]._1_3_ = 0;
                                  result.m_backend.data._M_elems._32_5_ = 0;
                                  result.m_backend.data._M_elems[9]._1_3_ = 0;
                                  result.m_backend.exp = 0;
                                  result.m_backend.neg = false;
                                  if (&result != pnVar41) {
                                    uVar8 = *(undefined8 *)((pnVar41->m_backend).data._M_elems + 8);
                                    result.m_backend.data._M_elems._32_5_ = SUB85(uVar8,0);
                                    result.m_backend.data._M_elems[9]._1_3_ =
                                         (undefined3)((ulong)uVar8 >> 0x28);
                                    result.m_backend.data._M_elems._0_16_ =
                                         *(undefined1 (*) [16])&(pnVar41->m_backend).data;
                                    result.m_backend.data._M_elems._16_8_ =
                                         *(undefined8 *)((pnVar41->m_backend).data._M_elems + 4);
                                    uVar8 = *(undefined8 *)((pnVar41->m_backend).data._M_elems + 6);
                                    result.m_backend.data._M_elems._24_5_ = SUB85(uVar8,0);
                                    result.m_backend.data._M_elems[7]._1_3_ =
                                         (undefined3)((ulong)uVar8 >> 0x28);
                                    result.m_backend.exp = (pnVar41->m_backend).exp;
                                    result.m_backend.neg = (pnVar41->m_backend).neg;
                                    result.m_backend.fpclass = (pnVar41->m_backend).fpclass;
                                    result.m_backend.prec_elem = (pnVar41->m_backend).prec_elem;
                                  }
                                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                                  operator+=(&result.m_backend,&result_2.m_backend);
                                  (*(lp->
                                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    ).
                                    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    .
                                    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                    ._vptr_ClassArray[0x2d])(lp,lVar32,&result,0);
                                }
                                else {
LAB_003124ee:
                                  ::soplex::infinity::__tls_init();
                                  result.m_backend.fpclass = cpp_dec_float_finite;
                                  result.m_backend.prec_elem = 10;
                                  result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                                  result.m_backend.data._M_elems[4] = 0;
                                  result.m_backend.data._M_elems[5] = 0;
                                  result.m_backend.data._M_elems._24_5_ = 0;
                                  result.m_backend.data._M_elems[7]._1_3_ = 0;
                                  result.m_backend.data._M_elems._32_5_ = 0;
                                  result.m_backend.data._M_elems[9]._1_3_ = 0;
                                  result.m_backend.exp = 0;
                                  result.m_backend.neg = false;
                                  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::
                                  operator=((cpp_dec_float<50u,int,void> *)&result,local_838);
                                  (*(lp->
                                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    ).
                                    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    .
                                    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                    ._vptr_ClassArray[0x2d])(lp,lVar32,&result,0);
                                }
                              }
LAB_00312d91:
                              remCol.data[lVar27] = true;
                              piVar12 = (this->m_stat).data + 0xe;
                              *piVar12 = *piVar12 + 1;
                              if (da_perm.data != (int *)0x0) {
                                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                           da_perm.data);
                              }
                            }
                          }
                        }
                      }
                    }
                    lVar42 = lVar42 + 1;
                    pDVar29 = (this->m_dupCols).data.
                              super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + lVar34;
                    local_6c8 = local_6c8 + 0x3c;
                  } while (lVar42 < (pDVar29->
                                    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    ).memused);
                }
                local_718 = local_718 + 1;
                lVar42 = (long)(this->m_dupCols).data.
                               super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[lVar34].
                               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               .memused;
                bVar30 = local_718 < lVar42;
                uVar40 = local_700;
              } while (local_718 < lVar42);
            }
          }
LAB_00313306:
          lVar34 = local_810 + 1;
          lVar42 = (long)(lp->
                         super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).
                         super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .set.thenum;
          bVar35 = lVar34 < lVar42;
        } while (lVar34 < lVar42);
      }
LAB_00313350:
      RVar19 = UNBOUNDED;
      if (!bVar35) {
        uVar33 = (lp->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thenum;
        uVar44 = (ulong)uVar33;
        if (0 < (int)uVar33) {
          lVar34 = 0;
          do {
            if (fixAndRemCol.data[lVar34] == true) {
              fixColumn(this,lp,(int)lVar34,false);
            }
            lVar34 = lVar34 + 1;
            uVar44 = (ulong)(lp->
                            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).
                            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .set.thenum;
          } while (lVar34 < (long)uVar44);
        }
        perm = (int *)0x0;
        iVar31 = (int)uVar44;
        spx_alloc<int*>(&perm,iVar31);
        uVar44 = uVar44 & 0xffffffff;
        if (iVar31 < 1) {
          uVar33 = 0;
          iVar36 = 0;
        }
        else {
          pIVar10 = (lp->
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .set.theitem;
          pDVar11 = (lp->
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .set.thekey;
          uVar39 = 0;
          iVar36 = 0;
          uVar33 = 0;
          do {
            if (remCol.data[uVar39] == true) {
              perm[uVar39] = -1;
              uVar33 = uVar33 + 1;
              iVar36 = iVar36 + pIVar10[pDVar11[uVar39].idx].data.
                                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                .memused;
            }
            else {
              perm[uVar39] = 0;
            }
            uVar39 = uVar39 + 1;
          } while (uVar44 != uVar39);
        }
        (*(lp->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._vptr_ClassArray[0x17])(lp,perm);
        if (0 < iVar31) {
          piVar12 = (this->m_cIdx).data;
          uVar39 = 0;
          do {
            if (-1 < (long)perm[uVar39]) {
              piVar12[perm[uVar39]] = piVar12[uVar39];
            }
            uVar39 = uVar39 + 1;
          } while (uVar44 != uVar39);
        }
        da_perm.data = (int *)0x0;
        da_perm.memFactor = 1.2;
        da_perm.thesize = 0;
        if (0 < iVar31) {
          da_perm.thesize = iVar31;
        }
        da_perm.themax = 1;
        if (0 < iVar31) {
          da_perm.themax = da_perm.thesize;
        }
        spx_alloc<int*>(&da_perm.data,da_perm.themax);
        if (0 < iVar31) {
          uVar39 = 0;
          do {
            da_perm.data[uVar39] = perm[uVar39];
            uVar39 = uVar39 + 1;
          } while (uVar44 != uVar39);
        }
        if ((uVar40 & 1) != 0) {
          pDVar23 = (DuplicateColsPS *)operator_new(0x168);
          local_38._0_4_ = cpp_dec_float_finite;
          local_38._4_4_ = 10;
          local_68._0_16_ = (undefined1  [16])0x0;
          local_68._16_13_ = SUB1613((undefined1  [16])0x0,0);
          uStack_4b = 0;
          auStack_48 = SUB1613((undefined1  [16])0x0,3);
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)local_68,1.0);
          DataArray<int>::DataArray(&local_628,&da_perm);
          local_6b8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (this->
               super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
          local_6b8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (this->
                  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
          if (local_6b8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_6b8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_6b8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_6b8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_6b8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          DuplicateColsPS::DuplicateColsPS
                    (pDVar23,lp,0,0,
                     (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)local_68,&local_628,&local_6b8,false,true);
          result.m_backend.data._M_elems._0_8_ = pDVar23;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::DuplicateColsPS*>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                     (result.m_backend.data._M_elems + 2),pDVar23);
          if (local_6b8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_6b8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_628.data != (int *)0x0) {
            free(local_628.data);
            local_628.data = (int *)0x0;
          }
          std::
          vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
          ::push_back(&(this->m_hist).data,(value_type *)&result);
          if (result.m_backend.data._M_elems._8_8_ != 0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       result.m_backend.data._M_elems._8_8_);
          }
        }
        free(perm);
        perm = (int *)0x0;
        if (0 < (int)uVar33) {
          piVar12 = &(this->
                     super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).m_remCols;
          *piVar12 = *piVar12 + uVar33;
          piVar12 = &(this->
                     super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).m_remNzos;
          *piVar12 = *piVar12 + iVar36;
          pSVar26 = (this->
                    super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).spxout;
          if ((pSVar26 != (SPxOut *)0x0) && (3 < (int)pSVar26->m_verbosity)) {
            result.m_backend.data._M_elems[0] = pSVar26->m_verbosity;
            result_2.m_backend.data._M_elems[0] = 4;
            (*pSVar26->_vptr_SPxOut[2])();
            pSVar26 = operator<<((this->
                                 super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 ).spxout,"Simplifier (duplicate columns) removed ");
            std::ostream::operator<<((ostream *)pSVar26->m_streams[pSVar26->m_verbosity],uVar33);
            pSVar26 = operator<<(pSVar26," cols, ");
            std::ostream::operator<<((ostream *)pSVar26->m_streams[pSVar26->m_verbosity],iVar36);
            pSVar26 = operator<<(pSVar26," non-zeros");
            std::endl<char,std::char_traits<char>>(pSVar26->m_streams[pSVar26->m_verbosity]);
            pSVar26 = (this->
                      super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).spxout;
            (*pSVar26->_vptr_SPxOut[2])(pSVar26,&result);
          }
          result_2.m_backend.fpclass = cpp_dec_float_finite;
          result_2.m_backend.prec_elem = 10;
          result_2.m_backend.data._M_elems[0] = 0;
          result_2.m_backend.data._M_elems[1] = 0;
          result_2.m_backend.data._M_elems[2] = 0;
          result_2.m_backend.data._M_elems[3] = 0;
          result_2.m_backend.data._M_elems[4] = 0;
          result_2.m_backend.data._M_elems[5] = 0;
          result_2.m_backend.data._M_elems._24_5_ = 0;
          result_2.m_backend.data._M_elems[7]._1_3_ = 0;
          result_2.m_backend.data._M_elems._32_5_ = 0;
          result_2.m_backend.data._M_elems[9]._1_3_ = 0;
          result_2.m_backend.exp = 0;
          result_2.m_backend.neg = false;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                    (&result.m_backend,(long)iVar31,(type *)0x0);
          pnVar28 = &(this->
                     super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).m_minReduction;
          if (&result_2 != pnVar28) {
            uVar8 = *(undefined8 *)
                     ((this->
                      super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).m_minReduction.m_backend.data._M_elems + 8);
            result_2.m_backend.data._M_elems._32_5_ = SUB85(uVar8,0);
            result_2.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar8 >> 0x28);
            result_2.m_backend.data._M_elems._0_16_ =
                 *(undefined1 (*) [16])(pnVar28->m_backend).data._M_elems;
            result_2.m_backend.data._M_elems._16_8_ =
                 *(undefined8 *)
                  ((this->
                   super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).m_minReduction.m_backend.data._M_elems + 4);
            uVar8 = *(undefined8 *)
                     ((this->
                      super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).m_minReduction.m_backend.data._M_elems + 6);
            result_2.m_backend.data._M_elems._24_5_ = SUB85(uVar8,0);
            result_2.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar8 >> 0x28);
            result_2.m_backend.exp =
                 (this->
                 super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).m_minReduction.m_backend.exp;
            result_2.m_backend.neg =
                 (this->
                 super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).m_minReduction.m_backend.neg;
            result_2.m_backend.fpclass =
                 (this->
                 super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).m_minReduction.m_backend.fpclass;
            result_2.m_backend.prec_elem =
                 (this->
                 super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).m_minReduction.m_backend.prec_elem;
          }
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                    (&result_2.m_backend,&result.m_backend);
          if (result_2.m_backend.fpclass != cpp_dec_float_NaN) {
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                      (&result.m_backend,(ulong)uVar33,(type *)0x0);
            iVar31 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (&result_2.m_backend,&result.m_backend);
            if (iVar31 < 0) {
              *again = true;
            }
          }
        }
        if (da_perm.data != (int *)0x0) {
          free(da_perm.data);
          da_perm.data = (int *)0x0;
        }
        RVar19 = OKAY;
      }
      if (m_perm_empty.data != (int *)0x0) {
        free(m_perm_empty.data);
        m_perm_empty.data = (int *)0x0;
      }
      if (fixAndRemCol.data != (bool *)0x0) {
        free(fixAndRemCol.data);
        fixAndRemCol.data = (bool *)0x0;
      }
      if (remCol.data != (bool *)0x0) {
        free(remCol.data);
        remCol.data = (bool *)0x0;
      }
      if (scale.data.
          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(scale.data.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)scale.data.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)scale.data.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (classSize.data != (int *)0x0) {
        free(classSize.data);
        classSize.data = (int *)0x0;
      }
      if (pClass.data != (int *)0x0) {
        free(pClass.data);
      }
    }
  }
  return RVar19;
}

Assistant:

typename SPxSimplifier<R>::Result SPxMainSM<R>::duplicateCols(SPxLPBase<R>& lp, bool& again)
{

   // This method simplifies the LP by removing duplicate columns
   // Duplicates are detected using the algorithm of Bixby and Wagner [1987]

   int remCols = 0;
   int remNzos = 0;

   // remove empty rows and columns
   typename SPxSimplifier<R>::Result ret = removeEmpty(lp);

   if(ret != this->OKAY)
      return ret;

   if(lp.nCols() < 2)
      return this->OKAY;

   DataArray<int>    pClass(lp.nCols());          // class of parallel columns
   DataArray<int>    classSize(lp.nCols());       // size of each class
   Array<R>   scale(lp.nCols());           // scaling factor for each column
   int*              idxMem = nullptr;

   try
   {
      spx_alloc(idxMem, lp.nCols());
   }
   catch(const SPxMemoryException& x)
   {
      spx_free(idxMem);
      throw x;
   }

   IdxSet idxSet(lp.nCols(), idxMem);  // set of feasible indices for new pClass

   // init
   pClass[0]    = 0;
   scale[0]     = 0.0;
   classSize[0] = lp.nCols();

   for(int j = 1; j < lp.nCols(); ++j)
   {
      pClass[j] = 0;
      scale[j]  = 0.0;
      classSize[j] = 0;
      idxSet.addIdx(j);
   }

   R oldVal = 0.0;

   // main loop
   for(int i = 0; i < lp.nRows(); ++i)
   {
      const SVectorBase<R>& row = lp.rowVector(i);

      for(int k = 0; k < row.size(); ++k)
      {
         R aij = row.value(k);
         int  j   = row.index(k);

         if(scale[j] == 0.0)
            scale[j] = aij;

         m_classSetCols[pClass[j]].add(j, aij / scale[j]);

         if(--classSize[pClass[j]] == 0)
            idxSet.addIdx(pClass[j]);
      }

      // update each parallel class with non-zero row entry
      for(int m = 0; m < row.size(); ++m)
      {
         int k = pClass[row.index(m)];

         if(m_classSetCols[k].size() > 0)
         {
            // sort classSet[k] w.r.t. scaled row values
            ElementCompare compare(this->tolerances()->epsilon());

            if(m_classSetCols[k].size() > 1)
            {
               // nonzeros should not contain nan or inf values
               assert(!m_classSetCols[k].hasNaNs());
               assert(!m_classSetCols[k].hasInfs());
               SPxQuicksort(m_classSetCols[k].mem(), m_classSetCols[k].size(), compare);
            }

            // use new index first
            int classIdx = idxSet.index(0);
            idxSet.remove(0);

            for(int l = 0; l < m_classSetCols[k].size(); ++l)
            {
               if(l != 0 && NErel(m_classSetCols[k].value(l), oldVal, this->epsZero()))
               {
                  // start new parallel class
                  classIdx = idxSet.index(0);
                  idxSet.remove(0);
               }

               pClass[m_classSetCols[k].index(l)] = classIdx;
               ++classSize[classIdx];

               oldVal = m_classSetCols[k].value(l);
            }

            m_classSetCols[k].clear();
         }
      }
   }

   spx_free(idxMem);

   DataArray<bool> remCol(lp.nCols());
   DataArray<bool> fixAndRemCol(lp.nCols());

   for(int k = 0; k < lp.nCols(); ++k)
      m_dupCols[k].clear();

   for(int k = 0; k < lp.nCols(); ++k)
   {
      remCol[k] = false;
      fixAndRemCol[k] = false;
      m_dupCols[pClass[k]].add(k, 0.0);
   }

   bool hasDuplicateCol = false;
   DataArray<int>  m_perm_empty(0);

   for(int k = 0; k < lp.nCols(); ++k)
   {
      if(m_dupCols[k].size() > 1 && !(lp.colVector(m_dupCols[k].index(0)).size() == 1))
      {
         SPxOut::debug(this, "IMAISM58 {} duplicate columns found\n", m_dupCols[k].size());

         if(!hasDuplicateCol)
         {
            std::shared_ptr<PostStep> ptr(new DuplicateColsPS(lp, 0, 0, 1.0, m_perm_empty, this->_tolerances,
                                          true));
            m_hist.append(ptr);
            hasDuplicateCol = true;
         }

         for(int l = 0; l < m_dupCols[k].size(); ++l)
         {
            for(int m = 0; m < m_dupCols[k].size(); ++m)
            {
               int j1  = m_dupCols[k].index(l);
               int j2  = m_dupCols[k].index(m);

               if(l != m && !remCol[j1] && !remCol[j2])
               {
                  R cj1 = lp.maxObj(j1);
                  R cj2 = lp.maxObj(j2);

                  // A.j1 = factor * A.j2
                  R factor = scale[j1] / scale[j2];
                  R objDif = cj1 - cj2 * scale[j1] / scale[j2];

                  SOPLEX_ASSERT_WARN("WMAISM59", isNotZero(factor, this->epsZero()));

                  if(isZero(objDif, this->epsZero()))
                  {
                     // case 1: objectives also duplicate

                     // if 0 is not within the column bounds, we are not able to postsolve if the aggregated column has
                     // status ZERO, hence we skip this case
                     if(LErel(lp.lower(j1), R(0.0), this->tolerances()->epsilon())
                           && GErel(lp.upper(j1), R(0.0), this->tolerances()->epsilon())
                           && LErel(lp.lower(j2), R(0.0), this->tolerances()->epsilon())
                           && GErel(lp.upper(j2), R(0.0), this->tolerances()->epsilon()))
                     {
                        std::shared_ptr<PostStep> ptr(new DuplicateColsPS(lp, j1, j2, factor, m_perm_empty,
                                                      this->_tolerances));
                        // variable substitution xj2' := xj2 + factor * xj1 <=> xj2 = -factor * xj1 + xj2'
                        m_hist.append(ptr);

                        // update bounds of remaining column j2 (new column j2')
                        if(factor > 0)
                        {
                           if(lp.lower(j2) <= R(-infinity) || lp.lower(j1) <= R(-infinity))
                              lp.changeLower(j2, R(-infinity));
                           else
                              lp.changeLower(j2, lp.lower(j2) + factor * lp.lower(j1));

                           if(lp.upper(j2) >= R(infinity) || lp.upper(j1) >= R(infinity))
                              lp.changeUpper(j2, R(infinity));
                           else
                              lp.changeUpper(j2, lp.upper(j2) + factor * lp.upper(j1));
                        }
                        else if(factor < 0)
                        {
                           if(lp.lower(j2) <= R(-infinity) || lp.upper(j1) >= R(infinity))
                              lp.changeLower(j2, R(-infinity));
                           else
                              lp.changeLower(j2, lp.lower(j2) + factor * lp.upper(j1));

                           if(lp.upper(j2) >= R(infinity) || lp.lower(j1) <= R(-infinity))
                              lp.changeUpper(j2, R(infinity));
                           else
                              lp.changeUpper(j2, lp.upper(j2) + factor * lp.lower(j1));
                        }

                        SPxOut::debug(this, "IMAISM60 two duplicate columns {}, {} replaced by one\n", j1, j2);

                        remCol[j1] = true;

                        ++m_stat[SUB_DUPLICATE_COL];
                     }
                     else
                     {
                        SPxOut::debug(this,
                                      "IMAISM80 not removing two duplicate columns {}, {} because zero not contained in their bounds\n",
                                      j1, j2);
                     }
                  }
                  else
                  {
                     // case 2: objectives not duplicate
                     // considered for maximization sense
                     if(lp.lower(j2) <= R(-infinity))
                     {
                        if(factor > 0 && objDif > 0)
                        {
                           if(lp.upper(j1) >= R(infinity))
                           {
                              SPxOut::debug(this, "IMAISM75 LP unbounded\n");
                              return this->UNBOUNDED;
                           }

                           // fix j1 at upper bound
                           SPxOut::debug(this, "IMAISM61 two duplicate columns {}, {} first one fixed at upper bound={}\n", j1,
                                         j2, lp.upper(j1));

                           std::shared_ptr<PostStep> ptr(new FixBoundsPS(lp, j1, lp.upper(j1), this->_tolerances));
                           m_hist.append(ptr);
                           lp.changeLower(j1, lp.upper(j1));
                        }
                        else if(factor < 0 && objDif < 0)
                        {
                           if(lp.lower(j1) <= R(-infinity))
                           {
                              SPxOut::debug(this, "IMAISM76 LP unbounded\n");
                              return this->UNBOUNDED;
                           }

                           // fix j1 at lower bound
                           SPxOut::debug(this, "IMAISM62 two duplicate columns {}, {} first one fixed at lower bound={}\n", j1,
                                         j2, lp.lower(j1));

                           std::shared_ptr<PostStep> ptr(new FixBoundsPS(lp, j1, lp.lower(j1), this->_tolerances));
                           m_hist.append(ptr);
                           lp.changeUpper(j1, lp.lower(j1));
                        }
                     }
                     else if(lp.upper(j2) >= R(infinity))
                     {
                        // fix j1 at upper bound
                        if(factor < 0 && objDif > 0)
                        {
                           if(lp.upper(j1) >= R(infinity))
                           {
                              SPxOut::debug(this, "IMAISM77 LP unbounded\n");
                              return this->UNBOUNDED;
                           }

                           // fix j1 at upper bound
                           SPxOut::debug(this, "IMAISM63 two duplicate columns {}, {},  first one fixed at upper bound={}\n",
                                         j1, j2, lp.upper(j1));

                           std::shared_ptr<PostStep> ptr(new FixBoundsPS(lp, j1, lp.upper(j1), this->_tolerances));
                           m_hist.append(ptr);
                           lp.changeLower(j1, lp.upper(j1));
                        }

                        // fix j1 at lower bound
                        else if(factor > 0 && objDif < 0)
                        {
                           if(lp.lower(j1) <= R(-infinity))
                           {
                              SPxOut::debug(this, "IMAISM78 LP unbounded\n");
                              return this->UNBOUNDED;
                           }

                           // fix j1 at lower bound
                           SPxOut::debug(this, "IMAISM64 two duplicate columns {}, {} first one fixed at lower bound={}\n", j1,
                                         j2, lp.lower(j1));

                           std::shared_ptr<PostStep> ptr(new FixBoundsPS(lp, j1, lp.lower(j1), this->_tolerances));
                           m_hist.append(ptr);
                           lp.changeUpper(j1, lp.lower(j1));
                        }
                     }

                     if(EQrel(lp.lower(j1), lp.upper(j1), feastol()))
                     {
                        remCol[j1] = true;
                        fixAndRemCol[j1] = true;

                        ++m_stat[FIX_DUPLICATE_COL];
                     }
                  }
               }
            }
         }
      }
   }

   for(int j = 0; j < lp.nCols(); ++j)
   {
      if(fixAndRemCol[j])
      {
         assert(remCol[j]);

         // correctIdx == false, because the index mapping will be handled by the postsolving in DuplicateColsPS
         fixColumn(lp, j, false);
      }
   }

   // remove all columns by one single method call (more efficient)
   const int nColsOld = lp.nCols();
   int* perm = nullptr;
   spx_alloc(perm, nColsOld);

   for(int j = 0; j < nColsOld; ++j)
   {
      if(remCol[j])
      {
         perm[j] = -1;
         ++remCols;
         remNzos += lp.colVector(j).size();
      }
      else
         perm[j] = 0;
   }

   lp.removeCols(perm);

   for(int j = 0; j < nColsOld; ++j)
   {
      if(perm[j] >= 0)
         m_cIdx[perm[j]] = m_cIdx[j];
   }

   DataArray<int> da_perm(nColsOld);

   for(int j = 0; j < nColsOld; ++j)
   {
      da_perm[j] = perm[j];
   }

   if(hasDuplicateCol)
   {
      std::shared_ptr<PostStep> ptr(new DuplicateColsPS(lp, 0, 0, 1.0, da_perm, this->_tolerances, false,
                                    true));
      m_hist.append(ptr);
   }

   spx_free(perm);

   assert(remCols > 0 || remNzos == 0);

   if(remCols > 0)
   {
      this->m_remCols += remCols;
      this->m_remNzos += remNzos;

      SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "Simplifier (duplicate columns) removed "
                    << remCols << " cols, "
                    << remNzos << " non-zeros"
                    << std::endl;)

      if(remCols > this->m_minReduction * nColsOld)
         again = true;
   }

   return this->OKAY;
}